

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  float fVar20;
  undefined1 auVar21 [16];
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar63;
  float fVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [32];
  byte bVar71;
  ulong uVar72;
  uint uVar73;
  ulong uVar74;
  long lVar75;
  long lVar76;
  Geometry *pGVar77;
  long lVar78;
  byte bVar79;
  uint uVar80;
  ulong uVar81;
  float fVar82;
  float fVar83;
  float fVar144;
  float fVar146;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar145;
  float fVar147;
  float fVar149;
  float fVar150;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar103 [16];
  float fVar148;
  float fVar151;
  float fVar152;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vint4 bi_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined4 uVar165;
  undefined8 uVar166;
  vint4 bi_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar182;
  vint4 bi;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  vint4 ai_2;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [64];
  vint4 ai_1;
  undefined1 auVar214 [16];
  undefined1 auVar215 [64];
  undefined1 auVar216 [64];
  float fVar219;
  float fVar220;
  undefined1 auVar217 [16];
  float fVar221;
  undefined1 auVar218 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  RTCFilterFunctionNArguments args;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  RTCFilterFunctionNArguments local_660;
  undefined1 local_630 [16];
  Geometry *local_618;
  undefined1 (*local_610) [32];
  Precalculations *local_608;
  undefined1 local_600 [32];
  ulong local_5d8;
  LinearSpace3fa *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  int local_3dc;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_380 [4];
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int iStack_21c;
  int iStack_218;
  int iStack_214;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  
  uVar72 = (ulong)(byte)prim[1];
  lVar78 = uVar72 * 0x25;
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xf + 6)));
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x11 + 6)));
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1a + 6)));
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1b + 6)));
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1c + 6)));
  uVar165 = *(undefined4 *)(prim + lVar78 + 0x12);
  auVar231._4_4_ = uVar165;
  auVar231._0_4_ = uVar165;
  auVar231._8_4_ = uVar165;
  auVar231._12_4_ = uVar165;
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar84 = vsubps_avx512vl(auVar96,*(undefined1 (*) [16])(prim + lVar78 + 6));
  fVar20 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar78 + 0x16)) *
           *(float *)(prim + lVar78 + 0x1a);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar234 = vpmovsxwd_avx(auVar96);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar102 = vpmovsxwd_avx(auVar99);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar103 = vpmovsxwd_avx(auVar98);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar168 = vpmovsxwd_avx(auVar97);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar6 = vpmovsxwd_avx(auVar6);
  auVar96 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar96 = vinsertps_avx512f(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar84 = vmulps_avx512vl(auVar231,auVar84);
  auVar85 = vmulps_avx512vl(auVar231,auVar96);
  auVar86 = vcvtdq2ps_avx512vl(auVar21);
  auVar87 = vcvtdq2ps_avx512vl(auVar92);
  auVar88 = vcvtdq2ps_avx512vl(auVar88);
  auVar89 = vcvtdq2ps_avx512vl(auVar89);
  auVar90 = vcvtdq2ps_avx512vl(auVar90);
  auVar96 = vcvtdq2ps_avx(auVar91);
  auVar99 = vcvtdq2ps_avx(auVar93);
  auVar98 = vcvtdq2ps_avx(auVar94);
  auVar97 = vcvtdq2ps_avx(auVar95);
  uVar165 = auVar85._0_4_;
  auVar191._4_4_ = uVar165;
  auVar191._0_4_ = uVar165;
  auVar191._8_4_ = uVar165;
  auVar191._12_4_ = uVar165;
  auVar21 = vshufps_avx(auVar85,auVar85,0x55);
  auVar92 = vshufps_avx(auVar85,auVar85,0xaa);
  auVar91 = vmulps_avx512vl(auVar92,auVar88);
  auVar167._0_4_ = auVar92._0_4_ * auVar96._0_4_;
  auVar167._4_4_ = auVar92._4_4_ * auVar96._4_4_;
  auVar167._8_4_ = auVar92._8_4_ * auVar96._8_4_;
  auVar167._12_4_ = auVar92._12_4_ * auVar96._12_4_;
  auVar85._0_4_ = auVar97._0_4_ * auVar92._0_4_;
  auVar85._4_4_ = auVar97._4_4_ * auVar92._4_4_;
  auVar85._8_4_ = auVar97._8_4_ * auVar92._8_4_;
  auVar85._12_4_ = auVar97._12_4_ * auVar92._12_4_;
  auVar92 = vfmadd231ps_avx512vl(auVar91,auVar21,auVar87);
  auVar91 = vfmadd231ps_avx512vl(auVar167,auVar21,auVar90);
  auVar21 = vfmadd231ps_fma(auVar85,auVar98,auVar21);
  auVar92 = vfmadd231ps_avx512vl(auVar92,auVar191,auVar86);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar191,auVar89);
  auVar21 = vfmadd231ps_fma(auVar21,auVar99,auVar191);
  auVar93 = vbroadcastss_avx512vl(auVar84);
  auVar94 = vshufps_avx512vl(auVar84,auVar84,0x55);
  auVar95 = vshufps_avx512vl(auVar84,auVar84,0xaa);
  auVar88 = vmulps_avx512vl(auVar95,auVar88);
  auVar96 = vmulps_avx512vl(auVar95,auVar96);
  auVar97 = vmulps_avx512vl(auVar95,auVar97);
  auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,auVar87);
  auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar90);
  auVar98 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar98);
  auVar85 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar86);
  auVar86 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar89);
  auVar84 = vfmadd231ps_fma(auVar98,auVar93,auVar99);
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar96);
  auVar99 = vandps_avx512vl(auVar92,auVar96);
  auVar229._8_4_ = 0x219392ef;
  auVar229._0_8_ = 0x219392ef219392ef;
  auVar229._12_4_ = 0x219392ef;
  uVar74 = vcmpps_avx512vl(auVar99,auVar229,1);
  bVar13 = (bool)((byte)uVar74 & 1);
  auVar87._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._0_4_;
  bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._4_4_;
  bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._8_4_;
  bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar92._12_4_;
  auVar99 = vandps_avx512vl(auVar91,auVar96);
  uVar74 = vcmpps_avx512vl(auVar99,auVar229,1);
  bVar13 = (bool)((byte)uVar74 & 1);
  auVar100._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._0_4_;
  bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._4_4_;
  bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._8_4_;
  bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._12_4_;
  auVar96 = vandps_avx512vl(auVar21,auVar96);
  uVar74 = vcmpps_avx512vl(auVar96,auVar229,1);
  bVar13 = (bool)((byte)uVar74 & 1);
  auVar101._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._0_4_;
  bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
  auVar101._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._4_4_;
  bVar13 = (bool)((byte)(uVar74 >> 2) & 1);
  auVar101._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._8_4_;
  bVar13 = (bool)((byte)(uVar74 >> 3) & 1);
  auVar101._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar21._12_4_;
  auVar225._8_4_ = 0x3f800000;
  auVar225._0_8_ = 0x3f8000003f800000;
  auVar225._12_4_ = 0x3f800000;
  auVar99 = vrcp14ps_avx512vl(auVar87);
  auVar96 = vfnmadd213ps_fma(auVar87,auVar99,auVar225);
  auVar98 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar100);
  auVar96 = vfnmadd213ps_fma(auVar100,auVar99,auVar225);
  auVar97 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
  auVar99 = vrcp14ps_avx512vl(auVar101);
  auVar96 = vfnmadd213ps_fma(auVar101,auVar99,auVar225);
  auVar94 = vfmadd132ps_fma(auVar96,auVar99,auVar99);
  auVar205._4_4_ = fVar20;
  auVar205._0_4_ = fVar20;
  auVar205._8_4_ = fVar20;
  auVar205._12_4_ = fVar20;
  auVar96 = vcvtdq2ps_avx(auVar234);
  auVar99 = vcvtdq2ps_avx(auVar102);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar95 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar96 = vcvtdq2ps_avx(auVar103);
  auVar99 = vcvtdq2ps_avx(auVar168);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar234 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar96 = vcvtdq2ps_avx(auVar6);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar72 * 0x16 + 6);
  auVar99 = vpmovsxwd_avx(auVar21);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar6 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar72 * 0x14 + 6);
  auVar96 = vpmovsxwd_avx(auVar92);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar72 * 0x18 + 6);
  auVar99 = vpmovsxwd_avx(auVar88);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar21 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar72 * 0x1d + 6);
  auVar96 = vpmovsxwd_avx(auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar72 * 0x21 + 6);
  auVar99 = vpmovsxwd_avx(auVar90);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar92 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar72 * 0x1f + 6);
  auVar96 = vpmovsxwd_avx(auVar91);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar72 * 0x23 + 6);
  auVar99 = vpmovsxwd_avx(auVar93);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,auVar96);
  auVar99 = vfmadd213ps_fma(auVar99,auVar205,auVar96);
  auVar96 = vsubps_avx(auVar95,auVar85);
  auVar206._0_4_ = auVar98._0_4_ * auVar96._0_4_;
  auVar206._4_4_ = auVar98._4_4_ * auVar96._4_4_;
  auVar206._8_4_ = auVar98._8_4_ * auVar96._8_4_;
  auVar206._12_4_ = auVar98._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar234,auVar85);
  auVar175._0_4_ = auVar98._0_4_ * auVar96._0_4_;
  auVar175._4_4_ = auVar98._4_4_ * auVar96._4_4_;
  auVar175._8_4_ = auVar98._8_4_ * auVar96._8_4_;
  auVar175._12_4_ = auVar98._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar6,auVar86);
  auVar214._0_4_ = auVar97._0_4_ * auVar96._0_4_;
  auVar214._4_4_ = auVar97._4_4_ * auVar96._4_4_;
  auVar214._8_4_ = auVar97._8_4_ * auVar96._8_4_;
  auVar214._12_4_ = auVar97._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar21,auVar86);
  auVar168._0_4_ = auVar97._0_4_ * auVar96._0_4_;
  auVar168._4_4_ = auVar97._4_4_ * auVar96._4_4_;
  auVar168._8_4_ = auVar97._8_4_ * auVar96._8_4_;
  auVar168._12_4_ = auVar97._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar92,auVar84);
  auVar86._0_4_ = auVar94._0_4_ * auVar96._0_4_;
  auVar86._4_4_ = auVar94._4_4_ * auVar96._4_4_;
  auVar86._8_4_ = auVar94._8_4_ * auVar96._8_4_;
  auVar86._12_4_ = auVar94._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar99,auVar84);
  auVar103._0_4_ = auVar94._0_4_ * auVar96._0_4_;
  auVar103._4_4_ = auVar94._4_4_ * auVar96._4_4_;
  auVar103._8_4_ = auVar94._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar94._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar206,auVar175);
  auVar99 = vpminsd_avx(auVar214,auVar168);
  auVar96 = vmaxps_avx(auVar96,auVar99);
  auVar99 = vpminsd_avx(auVar86,auVar103);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar94._4_4_ = uVar165;
  auVar94._0_4_ = uVar165;
  auVar94._8_4_ = uVar165;
  auVar94._12_4_ = uVar165;
  auVar99 = vmaxps_avx512vl(auVar99,auVar94);
  auVar96 = vmaxps_avx(auVar96,auVar99);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  local_310 = vmulps_avx512vl(auVar96,auVar95);
  auVar96 = vpmaxsd_avx(auVar206,auVar175);
  auVar99 = vpmaxsd_avx(auVar214,auVar168);
  auVar96 = vminps_avx(auVar96,auVar99);
  auVar99 = vpmaxsd_avx(auVar86,auVar103);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar234._4_4_ = uVar165;
  auVar234._0_4_ = uVar165;
  auVar234._8_4_ = uVar165;
  auVar234._12_4_ = uVar165;
  auVar99 = vminps_avx512vl(auVar99,auVar234);
  auVar96 = vminps_avx(auVar96,auVar99);
  auVar102._8_4_ = 0x3f800003;
  auVar102._0_8_ = 0x3f8000033f800003;
  auVar102._12_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar102);
  auVar99 = vpbroadcastd_avx512vl();
  uVar166 = vcmpps_avx512vl(local_310,auVar96,2);
  uVar23 = vpcmpgtd_avx512vl(auVar99,_DAT_01f4ad30);
  local_5c8 = (ulong)((byte)uVar166 & 0xf & (byte)uVar23);
  local_5d0 = pre->ray_space + k;
  local_610 = (undefined1 (*) [32])&local_140;
  local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar236 = ZEXT464(0xbf800000);
  local_608 = pre;
  do {
    if (local_5c8 == 0) {
      return;
    }
    lVar78 = 0;
    for (uVar74 = local_5c8; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
      lVar78 = lVar78 + 1;
    }
    uVar7 = *(uint *)(prim + 2);
    uVar80 = *(uint *)(prim + lVar78 * 4 + 6);
    uVar74 = (ulong)uVar80;
    pGVar77 = (context->scene->geometries).items[uVar7].ptr;
    uVar72 = (ulong)*(uint *)(*(long *)&pGVar77->field_0x58 +
                             uVar74 * pGVar77[1].super_RefCount.refCounter.
                                      super___atomic_base<unsigned_long>._M_i);
    fVar20 = (pGVar77->time_range).lower;
    fVar20 = pGVar77->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0xe0) - fVar20) / ((pGVar77->time_range).upper - fVar20));
    auVar96 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
    auVar99 = vaddss_avx512f(ZEXT416((uint)pGVar77->fnumTimeSegments),auVar236._0_16_);
    auVar96 = vminss_avx(auVar96,auVar99);
    auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
    fVar20 = fVar20 - auVar96._0_4_;
    _Var10 = pGVar77[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar76 = (long)(int)auVar96._0_4_ * 0x38;
    lVar78 = *(long *)(_Var10 + 0x10 + lVar76);
    lVar75 = *(long *)(_Var10 + 0x38 + lVar76);
    lVar11 = *(long *)(_Var10 + 0x48 + lVar76);
    auVar169._4_4_ = fVar20;
    auVar169._0_4_ = fVar20;
    auVar169._8_4_ = fVar20;
    auVar169._12_4_ = fVar20;
    pfVar3 = (float *)(lVar75 + uVar72 * lVar11);
    auVar226._0_4_ = fVar20 * *pfVar3;
    auVar226._4_4_ = fVar20 * pfVar3[1];
    auVar226._8_4_ = fVar20 * pfVar3[2];
    auVar226._12_4_ = fVar20 * pfVar3[3];
    pfVar3 = (float *)(lVar75 + (uVar72 + 1) * lVar11);
    auVar230._0_4_ = fVar20 * *pfVar3;
    auVar230._4_4_ = fVar20 * pfVar3[1];
    auVar230._8_4_ = fVar20 * pfVar3[2];
    auVar230._12_4_ = fVar20 * pfVar3[3];
    auVar96 = vmulps_avx512vl(auVar169,*(undefined1 (*) [16])(lVar75 + (uVar72 + 2) * lVar11));
    auVar99 = vmulps_avx512vl(auVar169,*(undefined1 (*) [16])(lVar75 + lVar11 * (uVar72 + 3)));
    lVar75 = *(long *)(_Var10 + lVar76);
    fVar20 = 1.0 - fVar20;
    auVar84._4_4_ = fVar20;
    auVar84._0_4_ = fVar20;
    auVar84._8_4_ = fVar20;
    auVar84._12_4_ = fVar20;
    auVar97 = vfmadd231ps_fma(auVar226,auVar84,*(undefined1 (*) [16])(lVar75 + lVar78 * uVar72));
    auVar6 = vfmadd231ps_fma(auVar230,auVar84,*(undefined1 (*) [16])(lVar75 + lVar78 * (uVar72 + 1))
                            );
    auVar93 = vfmadd231ps_avx512vl
                        (auVar96,auVar84,*(undefined1 (*) [16])(lVar75 + lVar78 * (uVar72 + 2)));
    auVar94 = vfmadd231ps_avx512vl
                        (auVar99,auVar84,*(undefined1 (*) [16])(lVar75 + lVar78 * (uVar72 + 3)));
    iVar8 = (int)pGVar77[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar98 = vsubps_avx(auVar97,auVar96);
    uVar165 = auVar98._0_4_;
    auVar183._4_4_ = uVar165;
    auVar183._0_4_ = uVar165;
    auVar183._8_4_ = uVar165;
    auVar183._12_4_ = uVar165;
    auVar99 = vshufps_avx(auVar98,auVar98,0x55);
    aVar4 = (local_5d0->vx).field_0;
    aVar5 = (local_5d0->vy).field_0;
    auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
    fVar20 = (local_5d0->vz).field_0.m128[0];
    fVar62 = *(float *)((long)&(local_5d0->vz).field_0 + 4);
    fVar63 = *(float *)((long)&(local_5d0->vz).field_0 + 8);
    fVar64 = *(float *)((long)&(local_5d0->vz).field_0 + 0xc);
    auVar217._0_4_ = fVar20 * auVar98._0_4_;
    auVar217._4_4_ = fVar62 * auVar98._4_4_;
    auVar217._8_4_ = fVar63 * auVar98._8_4_;
    auVar217._12_4_ = fVar64 * auVar98._12_4_;
    auVar99 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar99);
    auVar21 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar183);
    auVar98 = vsubps_avx(auVar6,auVar96);
    uVar165 = auVar98._0_4_;
    auVar184._4_4_ = uVar165;
    auVar184._0_4_ = uVar165;
    auVar184._8_4_ = uVar165;
    auVar184._12_4_ = uVar165;
    auVar99 = vshufps_avx(auVar98,auVar98,0x55);
    auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar222._0_4_ = fVar20 * auVar98._0_4_;
    auVar222._4_4_ = fVar62 * auVar98._4_4_;
    auVar222._8_4_ = fVar63 * auVar98._8_4_;
    auVar222._12_4_ = fVar64 * auVar98._12_4_;
    auVar99 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar5,auVar99);
    auVar92 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar184);
    auVar98 = vsubps_avx512vl(auVar93,auVar96);
    uVar165 = auVar98._0_4_;
    auVar185._4_4_ = uVar165;
    auVar185._0_4_ = uVar165;
    auVar185._8_4_ = uVar165;
    auVar185._12_4_ = uVar165;
    auVar99 = vshufps_avx(auVar98,auVar98,0x55);
    auVar98 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar224._0_4_ = fVar20 * auVar98._0_4_;
    auVar224._4_4_ = fVar62 * auVar98._4_4_;
    auVar224._8_4_ = fVar63 * auVar98._8_4_;
    auVar224._12_4_ = fVar64 * auVar98._12_4_;
    auVar99 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar5,auVar99);
    auVar98 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar185);
    auVar99 = vsubps_avx512vl(auVar94,auVar96);
    uVar165 = auVar99._0_4_;
    auVar186._4_4_ = uVar165;
    auVar186._0_4_ = uVar165;
    auVar186._8_4_ = uVar165;
    auVar186._12_4_ = uVar165;
    auVar96 = vshufps_avx(auVar99,auVar99,0x55);
    auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
    auVar228._0_4_ = fVar20 * auVar99._0_4_;
    auVar228._4_4_ = fVar62 * auVar99._4_4_;
    auVar228._8_4_ = fVar63 * auVar99._8_4_;
    auVar228._12_4_ = fVar64 * auVar99._12_4_;
    auVar96 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar96);
    lVar78 = (long)iVar8 * 0x44;
    auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar78);
    auVar88 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar186);
    uVar165 = auVar21._0_4_;
    local_460._4_4_ = uVar165;
    local_460._0_4_ = uVar165;
    local_460._8_4_ = uVar165;
    local_460._12_4_ = uVar165;
    local_460._16_4_ = uVar165;
    local_460._20_4_ = uVar165;
    local_460._24_4_ = uVar165;
    local_460._28_4_ = uVar165;
    auVar104._8_4_ = 1;
    auVar104._0_8_ = 0x100000001;
    auVar104._12_4_ = 1;
    auVar104._16_4_ = 1;
    auVar104._20_4_ = 1;
    auVar104._24_4_ = 1;
    auVar104._28_4_ = 1;
    local_480 = vpermps_avx2(auVar104,ZEXT1632(auVar21));
    auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x484);
    uVar165 = auVar92._0_4_;
    auVar187._4_4_ = uVar165;
    auVar187._0_4_ = uVar165;
    auVar187._8_4_ = uVar165;
    auVar187._12_4_ = uVar165;
    local_4a0._16_4_ = uVar165;
    local_4a0._0_16_ = auVar187;
    local_4a0._20_4_ = uVar165;
    local_4a0._24_4_ = uVar165;
    local_4a0._28_4_ = uVar165;
    local_4c0 = vpermps_avx512vl(auVar104,ZEXT1632(auVar92));
    auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x908);
    local_4e0 = vbroadcastss_avx512vl(auVar98);
    auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0xd8c);
    local_500 = vpermps_avx512vl(auVar104,ZEXT1632(auVar98));
    uVar165 = auVar88._0_4_;
    local_520._4_4_ = uVar165;
    local_520._0_4_ = uVar165;
    fStack_518 = (float)uVar165;
    fStack_514 = (float)uVar165;
    fStack_510 = (float)uVar165;
    fStack_50c = (float)uVar165;
    fStack_508 = (float)uVar165;
    register0x0000139c = uVar165;
    _local_540 = vpermps_avx512vl(auVar104,ZEXT1632(auVar88));
    auVar104 = vmulps_avx512vl(_local_520,auVar116);
    auVar105 = vmulps_avx512vl(_local_540,auVar116);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_4e0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar117,local_500);
    auVar96 = vfmadd231ps_fma(auVar104,auVar119,local_4a0);
    auVar106 = vfmadd231ps_avx512vl(auVar105,auVar119,local_4c0);
    auVar107 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar118,local_460);
    auVar213 = ZEXT3264(auVar107);
    auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar78);
    auVar105 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x484);
    auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x908);
    auVar114 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0xd8c);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,local_480);
    auVar204 = ZEXT3264(auVar106);
    auVar108 = vmulps_avx512vl(_local_520,auVar114);
    auVar109 = vmulps_avx512vl(_local_540,auVar114);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar115,local_4e0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar115,local_500);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_4a0);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_4c0);
    auVar89 = vfmadd231ps_fma(auVar108,auVar104,local_460);
    auVar215 = ZEXT1664(auVar89);
    auVar90 = vfmadd231ps_fma(auVar109,auVar104,local_480);
    auVar108 = vsubps_avx512vl(ZEXT1632(auVar89),auVar107);
    auVar109 = vsubps_avx512vl(ZEXT1632(auVar90),auVar106);
    auVar110 = vmulps_avx512vl(auVar106,auVar108);
    auVar111 = vmulps_avx512vl(auVar107,auVar109);
    auVar110 = vsubps_avx512vl(auVar110,auVar111);
    auVar96 = vshufps_avx(auVar97,auVar97,0xff);
    uVar166 = auVar96._0_8_;
    local_80._8_8_ = uVar166;
    local_80._0_8_ = uVar166;
    local_80._16_8_ = uVar166;
    local_80._24_8_ = uVar166;
    auVar96 = vshufps_avx(auVar6,auVar6,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar96);
    auVar96 = vshufps_avx512vl(auVar93,auVar93,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar96);
    auVar96 = vshufps_avx512vl(auVar94,auVar94,0xff);
    uVar166 = auVar96._0_8_;
    local_e0._8_8_ = uVar166;
    local_e0._0_8_ = uVar166;
    local_e0._16_8_ = uVar166;
    local_e0._24_8_ = uVar166;
    auVar111 = vmulps_avx512vl(local_e0,auVar116);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar117,local_c0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_a0);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_80);
    auVar112 = vmulps_avx512vl(local_e0,auVar114);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar115,local_c0);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_a0);
    auVar91 = vfmadd231ps_fma(auVar112,auVar104,local_80);
    auVar112 = vmulps_avx512vl(auVar109,auVar109);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar113 = vmaxps_avx512vl(auVar111,ZEXT1632(auVar91));
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vmulps_avx512vl(auVar113,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    uVar166 = vcmpps_avx512vl(auVar110,auVar112,2);
    auVar96 = vblendps_avx(auVar21,auVar97,8);
    auVar234 = auVar235._0_16_;
    auVar99 = vandps_avx512vl(auVar96,auVar234);
    auVar96 = vblendps_avx(auVar92,auVar6,8);
    auVar96 = vandps_avx512vl(auVar96,auVar234);
    auVar99 = vmaxps_avx(auVar99,auVar96);
    auVar96 = vblendps_avx(auVar98,auVar93,8);
    auVar95 = vandps_avx512vl(auVar96,auVar234);
    auVar96 = vblendps_avx(auVar88,auVar94,8);
    auVar96 = vandps_avx512vl(auVar96,auVar234);
    auVar96 = vmaxps_avx(auVar95,auVar96);
    auVar96 = vmaxps_avx(auVar99,auVar96);
    auVar99 = vmovshdup_avx(auVar96);
    auVar99 = vmaxss_avx(auVar99,auVar96);
    auVar96 = vshufpd_avx(auVar96,auVar96,1);
    auVar96 = vmaxss_avx(auVar96,auVar99);
    auVar99 = vcvtsi2ss_avx512f(auVar234,iVar8);
    local_5c0._0_16_ = auVar99;
    auVar112._0_4_ = auVar99._0_4_;
    auVar112._4_4_ = auVar112._0_4_;
    auVar112._8_4_ = auVar112._0_4_;
    auVar112._12_4_ = auVar112._0_4_;
    auVar112._16_4_ = auVar112._0_4_;
    auVar112._20_4_ = auVar112._0_4_;
    auVar112._24_4_ = auVar112._0_4_;
    auVar112._28_4_ = auVar112._0_4_;
    uVar23 = vcmpps_avx512vl(auVar112,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar166 & (byte)uVar23;
    local_630 = vmulss_avx512f(auVar96,SUB6416(ZEXT464(0x35000000),0));
    auVar110._8_4_ = 2;
    auVar110._0_8_ = 0x200000002;
    auVar110._12_4_ = 2;
    auVar110._16_4_ = 2;
    auVar110._20_4_ = 2;
    auVar110._24_4_ = 2;
    auVar110._28_4_ = 2;
    local_240 = vpermps_avx2(auVar110,ZEXT1632(auVar21));
    local_260 = vpermps_avx2(auVar110,ZEXT1632(auVar92));
    local_280 = vpermps_avx2(auVar110,ZEXT1632(auVar98));
    local_2a0 = vpermps_avx2(auVar110,ZEXT1632(auVar88));
    local_560 = *(undefined4 *)(ray + k * 4 + 0x60);
    uStack_55c = 0;
    uStack_558 = 0;
    uStack_554 = 0;
    local_2c0 = vpbroadcastd_avx512vl();
    local_2e0 = vpbroadcastd_avx512vl();
    local_670 = auVar97._0_8_;
    uStack_668 = auVar97._8_8_;
    local_680 = auVar6._0_8_;
    uStack_678 = auVar6._8_8_;
    local_690 = auVar93._0_8_;
    uStack_688 = auVar93._8_8_;
    local_6a0._0_4_ = auVar94._0_4_;
    fVar20 = (float)local_6a0;
    local_6a0._4_4_ = auVar94._4_4_;
    fVar62 = local_6a0._4_4_;
    uStack_698._0_4_ = auVar94._8_4_;
    fVar63 = (float)uStack_698;
    uStack_698._4_4_ = auVar94._12_4_;
    fVar64 = uStack_698._4_4_;
    local_6a0 = auVar94._0_8_;
    uStack_698 = auVar94._8_8_;
    if (bVar79 != 0) {
      auVar114 = vmulps_avx512vl(local_2a0,auVar114);
      auVar115 = vfmadd213ps_avx512vl(auVar115,local_280,auVar114);
      auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar115);
      auVar114 = vfmadd213ps_avx512vl(auVar104,local_240,auVar105);
      auVar116 = vmulps_avx512vl(local_2a0,auVar116);
      auVar117 = vfmadd213ps_avx512vl(auVar117,local_280,auVar116);
      auVar105 = vfmadd213ps_avx512vl(auVar119,local_260,auVar117);
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x1210);
      auVar117 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x1694);
      auVar116 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x1b18);
      auVar104 = *(undefined1 (*) [32])(bspline_basis0 + lVar78 + 0x1f9c);
      auVar110 = vfmadd213ps_avx512vl(auVar118,local_240,auVar105);
      auVar118 = vmulps_avx512vl(_local_520,auVar104);
      auVar105 = vmulps_avx512vl(_local_540,auVar104);
      auVar104 = vmulps_avx512vl(local_2a0,auVar104);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_4e0);
      auVar105 = vfmadd231ps_avx512vl(auVar105,auVar116,local_500);
      auVar116 = vfmadd231ps_avx512vl(auVar104,local_280,auVar116);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar117,local_4a0);
      auVar104 = vfmadd231ps_avx512vl(auVar105,auVar117,local_4c0);
      auVar105 = vfmadd231ps_avx512vl(auVar116,local_260,auVar117);
      auVar96 = vfmadd231ps_fma(auVar118,auVar119,local_460);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar119,local_480);
      auVar118 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x1210);
      auVar117 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x1b18);
      auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x1f9c);
      auVar105 = vfmadd231ps_avx512vl(auVar105,local_240,auVar119);
      auVar119 = vmulps_avx512vl(_local_520,auVar116);
      auVar115 = vmulps_avx512vl(_local_540,auVar116);
      auVar116 = vmulps_avx512vl(local_2a0,auVar116);
      auVar113 = vfmadd231ps_avx512vl(auVar119,auVar117,local_4e0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,local_500);
      auVar117 = vfmadd231ps_avx512vl(auVar116,local_280,auVar117);
      auVar235 = ZEXT1664(auVar234);
      auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar78 + 0x1694);
      auVar116 = vfmadd231ps_avx512vl(auVar113,auVar119,local_4a0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_4c0);
      auVar119 = vfmadd231ps_avx512vl(auVar117,local_260,auVar119);
      auVar236 = ZEXT1664(auVar236._0_16_);
      auVar99 = vfmadd231ps_fma(auVar116,auVar118,local_460);
      auVar117 = vfmadd231ps_avx512vl(auVar115,auVar118,local_480);
      auVar116 = vfmadd231ps_avx512vl(auVar119,local_240,auVar118);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar232._16_4_ = 0x7fffffff;
      auVar232._20_4_ = 0x7fffffff;
      auVar232._24_4_ = 0x7fffffff;
      auVar232._28_4_ = 0x7fffffff;
      auVar118 = vandps_avx(ZEXT1632(auVar96),auVar232);
      auVar119 = vandps_avx(auVar104,auVar232);
      auVar119 = vmaxps_avx(auVar118,auVar119);
      auVar118 = vandps_avx(auVar105,auVar232);
      auVar118 = vmaxps_avx(auVar119,auVar118);
      auVar227._4_4_ = local_630._0_4_;
      auVar227._0_4_ = local_630._0_4_;
      auVar227._8_4_ = local_630._0_4_;
      auVar227._12_4_ = local_630._0_4_;
      auVar227._16_4_ = local_630._0_4_;
      auVar227._20_4_ = local_630._0_4_;
      auVar227._24_4_ = local_630._0_4_;
      auVar227._28_4_ = local_630._0_4_;
      uVar72 = vcmpps_avx512vl(auVar118,auVar227,1);
      bVar13 = (bool)((byte)uVar72 & 1);
      auVar113._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar96._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar96._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar96._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar96._12_4_);
      fVar219 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar108._16_4_);
      auVar113._16_4_ = fVar219;
      fVar174 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar108._20_4_);
      auVar113._20_4_ = fVar174;
      fVar220 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar108._24_4_);
      auVar113._24_4_ = fVar220;
      uVar73 = (uint)(byte)(uVar72 >> 7) * auVar108._28_4_;
      auVar113._28_4_ = uVar73;
      bVar13 = (bool)((byte)uVar72 & 1);
      auVar120._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar104._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar104._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar104._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar104._12_4_);
      bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar120._16_4_ = (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar104._16_4_);
      bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar120._20_4_ = (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar104._20_4_);
      bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar120._24_4_ = (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar104._24_4_);
      bVar13 = SUB81(uVar72 >> 7,0);
      auVar120._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar104._28_4_;
      auVar118 = vandps_avx(auVar232,ZEXT1632(auVar99));
      auVar119 = vandps_avx(auVar117,auVar232);
      auVar119 = vmaxps_avx(auVar118,auVar119);
      auVar118 = vandps_avx(auVar116,auVar232);
      auVar118 = vmaxps_avx(auVar119,auVar118);
      uVar72 = vcmpps_avx512vl(auVar118,auVar227,1);
      bVar13 = (bool)((byte)uVar72 & 1);
      auVar121._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar99._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar99._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar99._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar99._12_4_);
      fVar221 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar108._16_4_);
      auVar121._16_4_ = fVar221;
      fVar173 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar108._20_4_);
      auVar121._20_4_ = fVar173;
      fVar182 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar108._24_4_);
      auVar121._24_4_ = fVar182;
      auVar121._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar108._28_4_;
      bVar13 = (bool)((byte)uVar72 & 1);
      auVar122._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar117._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar122._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar117._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar122._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar117._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar122._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar117._12_4_);
      bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar122._16_4_ = (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar117._16_4_);
      bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar122._20_4_ = (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar117._20_4_);
      bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar122._24_4_ = (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar117._24_4_);
      bVar13 = SUB81(uVar72 >> 7,0);
      auVar122._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar117._28_4_;
      auVar102 = vxorps_avx512vl(auVar187,auVar187);
      auVar118 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar102));
      auVar96 = vfmadd231ps_fma(auVar118,auVar120,auVar120);
      auVar117 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
      fVar82 = auVar117._0_4_;
      fVar83 = auVar117._4_4_;
      fVar144 = auVar117._8_4_;
      fVar145 = auVar117._12_4_;
      fVar146 = auVar117._16_4_;
      fVar147 = auVar117._20_4_;
      fVar149 = auVar117._24_4_;
      auVar118._4_4_ = fVar83 * fVar83 * fVar83 * auVar96._4_4_ * -0.5;
      auVar118._0_4_ = fVar82 * fVar82 * fVar82 * auVar96._0_4_ * -0.5;
      auVar118._8_4_ = fVar144 * fVar144 * fVar144 * auVar96._8_4_ * -0.5;
      auVar118._12_4_ = fVar145 * fVar145 * fVar145 * auVar96._12_4_ * -0.5;
      auVar118._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar118._20_4_ = fVar147 * fVar147 * fVar147 * -0.0;
      auVar118._24_4_ = fVar149 * fVar149 * fVar149 * -0.0;
      auVar118._28_4_ = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar104,auVar117);
      auVar119._4_4_ = auVar120._4_4_ * auVar118._4_4_;
      auVar119._0_4_ = auVar120._0_4_ * auVar118._0_4_;
      auVar119._8_4_ = auVar120._8_4_ * auVar118._8_4_;
      auVar119._12_4_ = auVar120._12_4_ * auVar118._12_4_;
      auVar119._16_4_ = auVar120._16_4_ * auVar118._16_4_;
      auVar119._20_4_ = auVar120._20_4_ * auVar118._20_4_;
      auVar119._24_4_ = auVar120._24_4_ * auVar118._24_4_;
      auVar119._28_4_ = auVar117._28_4_;
      auVar117._4_4_ = auVar118._4_4_ * -auVar113._4_4_;
      auVar117._0_4_ = auVar118._0_4_ * -auVar113._0_4_;
      auVar117._8_4_ = auVar118._8_4_ * -auVar113._8_4_;
      auVar117._12_4_ = auVar118._12_4_ * -auVar113._12_4_;
      auVar117._16_4_ = auVar118._16_4_ * -fVar219;
      auVar117._20_4_ = auVar118._20_4_ * -fVar174;
      auVar117._24_4_ = auVar118._24_4_ * -fVar220;
      auVar117._28_4_ = uVar73 ^ 0x80000000;
      auVar108 = vmulps_avx512vl(auVar118,ZEXT1632(auVar102));
      auVar109 = ZEXT1632(auVar102);
      auVar116 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar109);
      auVar96 = vfmadd231ps_fma(auVar116,auVar122,auVar122);
      auVar115 = vrsqrt14ps_avx512vl(ZEXT1632(auVar96));
      fVar174 = auVar115._0_4_;
      fVar219 = auVar115._4_4_;
      fVar220 = auVar115._8_4_;
      fVar82 = auVar115._12_4_;
      fVar83 = auVar115._16_4_;
      fVar144 = auVar115._20_4_;
      fVar145 = auVar115._24_4_;
      auVar116._4_4_ = fVar219 * fVar219 * fVar219 * auVar96._4_4_ * -0.5;
      auVar116._0_4_ = fVar174 * fVar174 * fVar174 * auVar96._0_4_ * -0.5;
      auVar116._8_4_ = fVar220 * fVar220 * fVar220 * auVar96._8_4_ * -0.5;
      auVar116._12_4_ = fVar82 * fVar82 * fVar82 * auVar96._12_4_ * -0.5;
      auVar116._16_4_ = fVar83 * fVar83 * fVar83 * -0.0;
      auVar116._20_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar116._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
      auVar116._28_4_ = 0;
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar104,auVar115);
      auVar105._4_4_ = auVar122._4_4_ * auVar116._4_4_;
      auVar105._0_4_ = auVar122._0_4_ * auVar116._0_4_;
      auVar105._8_4_ = auVar122._8_4_ * auVar116._8_4_;
      auVar105._12_4_ = auVar122._12_4_ * auVar116._12_4_;
      auVar105._16_4_ = auVar122._16_4_ * auVar116._16_4_;
      auVar105._20_4_ = auVar122._20_4_ * auVar116._20_4_;
      auVar105._24_4_ = auVar122._24_4_ * auVar116._24_4_;
      auVar105._28_4_ = auVar115._28_4_;
      auVar115._4_4_ = -auVar121._4_4_ * auVar116._4_4_;
      auVar115._0_4_ = -auVar121._0_4_ * auVar116._0_4_;
      auVar115._8_4_ = -auVar121._8_4_ * auVar116._8_4_;
      auVar115._12_4_ = -auVar121._12_4_ * auVar116._12_4_;
      auVar115._16_4_ = -fVar221 * auVar116._16_4_;
      auVar115._20_4_ = -fVar173 * auVar116._20_4_;
      auVar115._24_4_ = -fVar182 * auVar116._24_4_;
      auVar115._28_4_ = auVar118._28_4_;
      auVar118 = vmulps_avx512vl(auVar116,auVar109);
      auVar96 = vfmadd213ps_fma(auVar119,auVar111,auVar107);
      auVar99 = vfmadd213ps_fma(auVar117,auVar111,auVar106);
      auVar116 = vfmadd213ps_avx512vl(auVar108,auVar111,auVar110);
      auVar104 = vfmadd213ps_avx512vl(auVar105,ZEXT1632(auVar91),ZEXT1632(auVar89));
      auVar94 = vfnmadd213ps_fma(auVar119,auVar111,auVar107);
      auVar107 = ZEXT1632(auVar91);
      auVar98 = vfmadd213ps_fma(auVar115,auVar107,ZEXT1632(auVar90));
      auVar95 = vfnmadd213ps_fma(auVar117,auVar111,auVar106);
      auVar21 = vfmadd213ps_fma(auVar118,auVar107,auVar114);
      auVar119 = vfnmadd231ps_avx512vl(auVar110,auVar111,auVar108);
      auVar89 = vfnmadd213ps_fma(auVar105,auVar107,ZEXT1632(auVar89));
      auVar90 = vfnmadd213ps_fma(auVar115,auVar107,ZEXT1632(auVar90));
      auVar234 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar91),auVar118);
      auVar117 = vsubps_avx512vl(auVar104,ZEXT1632(auVar94));
      auVar118 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar95));
      auVar105 = vsubps_avx512vl(ZEXT1632(auVar21),auVar119);
      auVar115 = vmulps_avx512vl(auVar118,auVar119);
      auVar92 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar95),auVar105);
      auVar114._4_4_ = auVar94._4_4_ * auVar105._4_4_;
      auVar114._0_4_ = auVar94._0_4_ * auVar105._0_4_;
      auVar114._8_4_ = auVar94._8_4_ * auVar105._8_4_;
      auVar114._12_4_ = auVar94._12_4_ * auVar105._12_4_;
      auVar114._16_4_ = auVar105._16_4_ * 0.0;
      auVar114._20_4_ = auVar105._20_4_ * 0.0;
      auVar114._24_4_ = auVar105._24_4_ * 0.0;
      auVar114._28_4_ = auVar105._28_4_;
      auVar105 = vfmsub231ps_avx512vl(auVar114,auVar119,auVar117);
      auVar106._4_4_ = auVar95._4_4_ * auVar117._4_4_;
      auVar106._0_4_ = auVar95._0_4_ * auVar117._0_4_;
      auVar106._8_4_ = auVar95._8_4_ * auVar117._8_4_;
      auVar106._12_4_ = auVar95._12_4_ * auVar117._12_4_;
      auVar106._16_4_ = auVar117._16_4_ * 0.0;
      auVar106._20_4_ = auVar117._20_4_ * 0.0;
      auVar106._24_4_ = auVar117._24_4_ * 0.0;
      auVar106._28_4_ = auVar117._28_4_;
      auVar88 = vfmsub231ps_fma(auVar106,ZEXT1632(auVar94),auVar118);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar88),auVar109,auVar105);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,ZEXT1632(auVar92));
      auVar110 = ZEXT1632(auVar102);
      uVar72 = vcmpps_avx512vl(auVar118,auVar110,2);
      bVar71 = (byte)uVar72;
      fVar82 = (float)((uint)(bVar71 & 1) * auVar96._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar89._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar144 = (float)((uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar89._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar146 = (float)((uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar89._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar149 = (float)((uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar89._12_4_);
      auVar115 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar146,CONCAT44(fVar144,fVar82))));
      fVar83 = (float)((uint)(bVar71 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar90._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar145 = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar90._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar147 = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar90._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar150 = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar90._12_4_);
      auVar114 = ZEXT1632(CONCAT412(fVar150,CONCAT48(fVar147,CONCAT44(fVar145,fVar83))));
      auVar123._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar234._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar123._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar234._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar123._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar234._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar123._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar234._12_4_);
      fVar174 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar116._16_4_);
      auVar123._16_4_ = fVar174;
      fVar219 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar116._20_4_);
      auVar123._20_4_ = fVar219;
      fVar220 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar116._24_4_);
      auVar123._24_4_ = fVar220;
      iVar1 = (uint)(byte)(uVar72 >> 7) * auVar116._28_4_;
      auVar123._28_4_ = iVar1;
      auVar117 = vblendmps_avx512vl(ZEXT1632(auVar94),auVar104);
      auVar124._0_4_ =
           (uint)(bVar71 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar99._0_4_;
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar99._4_4_;
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar99._8_4_;
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar99._12_4_;
      auVar124._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar117._16_4_;
      auVar124._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar117._20_4_;
      auVar124._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar117._24_4_;
      auVar124._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar117._28_4_;
      auVar117 = vblendmps_avx512vl(ZEXT1632(auVar95),ZEXT1632(auVar98));
      auVar125._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar92._0_4_);
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar125._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar92._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar125._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar92._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar125._12_4_ = (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar92._12_4_);
      fVar221 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar117._16_4_);
      auVar125._16_4_ = fVar221;
      fVar173 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar117._20_4_);
      auVar125._20_4_ = fVar173;
      fVar182 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar117._24_4_);
      auVar125._24_4_ = fVar182;
      auVar125._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar117._28_4_;
      auVar117 = vblendmps_avx512vl(auVar119,ZEXT1632(auVar21));
      auVar126._0_4_ =
           (float)((uint)(bVar71 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar116._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar126._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar116._4_4_);
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar126._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar116._8_4_);
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar126._12_4_ = (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar116._12_4_);
      bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar126._16_4_ = (float)((uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * auVar116._16_4_);
      bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar126._20_4_ = (float)((uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * auVar116._20_4_);
      bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar126._24_4_ = (float)((uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * auVar116._24_4_);
      bVar13 = SUB81(uVar72 >> 7,0);
      auVar126._28_4_ = (uint)bVar13 * auVar117._28_4_ | (uint)!bVar13 * auVar116._28_4_;
      auVar127._0_4_ =
           (uint)(bVar71 & 1) * (int)auVar94._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar104._0_4_;
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar127._4_4_ = (uint)bVar13 * (int)auVar94._4_4_ | (uint)!bVar13 * auVar104._4_4_;
      bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar127._8_4_ = (uint)bVar13 * (int)auVar94._8_4_ | (uint)!bVar13 * auVar104._8_4_;
      bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar127._12_4_ = (uint)bVar13 * (int)auVar94._12_4_ | (uint)!bVar13 * auVar104._12_4_;
      auVar127._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar104._16_4_;
      auVar127._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar104._20_4_;
      auVar127._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar104._24_4_;
      auVar127._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar104._28_4_;
      bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar128._0_4_ =
           (uint)(bVar71 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar21._0_4_;
      bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar14 * auVar119._4_4_ | (uint)!bVar14 * auVar21._4_4_;
      bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar14 * auVar119._8_4_ | (uint)!bVar14 * auVar21._8_4_;
      bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar14 * auVar119._12_4_ | (uint)!bVar14 * auVar21._12_4_;
      auVar128._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar119._16_4_;
      auVar128._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar119._20_4_;
      auVar128._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar119._24_4_;
      iVar2 = (uint)(byte)(uVar72 >> 7) * auVar119._28_4_;
      auVar128._28_4_ = iVar2;
      auVar106 = vsubps_avx512vl(auVar127,auVar115);
      auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar95._12_4_ |
                                               (uint)!bVar16 * auVar98._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar95._8_4_ |
                                                        (uint)!bVar15 * auVar98._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar95._4_4_ |
                                                                 (uint)!bVar13 * auVar98._4_4_,
                                                                 (uint)(bVar71 & 1) *
                                                                 (int)auVar95._0_4_ |
                                                                 (uint)!(bool)(bVar71 & 1) *
                                                                 auVar98._0_4_)))),auVar114);
      auVar213 = ZEXT3264(auVar119);
      auVar117 = vsubps_avx(auVar128,auVar123);
      auVar116 = vsubps_avx(auVar115,auVar124);
      auVar215 = ZEXT3264(auVar116);
      auVar104 = vsubps_avx(auVar114,auVar125);
      auVar105 = vsubps_avx(auVar123,auVar126);
      auVar107._4_4_ = auVar117._4_4_ * fVar144;
      auVar107._0_4_ = auVar117._0_4_ * fVar82;
      auVar107._8_4_ = auVar117._8_4_ * fVar146;
      auVar107._12_4_ = auVar117._12_4_ * fVar149;
      auVar107._16_4_ = auVar117._16_4_ * 0.0;
      auVar107._20_4_ = auVar117._20_4_ * 0.0;
      auVar107._24_4_ = auVar117._24_4_ * 0.0;
      auVar107._28_4_ = iVar2;
      auVar96 = vfmsub231ps_fma(auVar107,auVar123,auVar106);
      auVar108._4_4_ = fVar145 * auVar106._4_4_;
      auVar108._0_4_ = fVar83 * auVar106._0_4_;
      auVar108._8_4_ = fVar147 * auVar106._8_4_;
      auVar108._12_4_ = fVar150 * auVar106._12_4_;
      auVar108._16_4_ = auVar106._16_4_ * 0.0;
      auVar108._20_4_ = auVar106._20_4_ * 0.0;
      auVar108._24_4_ = auVar106._24_4_ * 0.0;
      auVar108._28_4_ = auVar118._28_4_;
      auVar99 = vfmsub231ps_fma(auVar108,auVar115,auVar119);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar110,ZEXT1632(auVar96));
      auVar198._0_4_ = auVar119._0_4_ * auVar123._0_4_;
      auVar198._4_4_ = auVar119._4_4_ * auVar123._4_4_;
      auVar198._8_4_ = auVar119._8_4_ * auVar123._8_4_;
      auVar198._12_4_ = auVar119._12_4_ * auVar123._12_4_;
      auVar198._16_4_ = auVar119._16_4_ * fVar174;
      auVar198._20_4_ = auVar119._20_4_ * fVar219;
      auVar198._24_4_ = auVar119._24_4_ * fVar220;
      auVar198._28_4_ = 0;
      auVar96 = vfmsub231ps_fma(auVar198,auVar114,auVar117);
      auVar107 = vfmadd231ps_avx512vl(auVar118,auVar110,ZEXT1632(auVar96));
      auVar118 = vmulps_avx512vl(auVar105,auVar124);
      auVar118 = vfmsub231ps_avx512vl(auVar118,auVar116,auVar126);
      auVar109._4_4_ = auVar104._4_4_ * auVar126._4_4_;
      auVar109._0_4_ = auVar104._0_4_ * auVar126._0_4_;
      auVar109._8_4_ = auVar104._8_4_ * auVar126._8_4_;
      auVar109._12_4_ = auVar104._12_4_ * auVar126._12_4_;
      auVar109._16_4_ = auVar104._16_4_ * auVar126._16_4_;
      auVar109._20_4_ = auVar104._20_4_ * auVar126._20_4_;
      auVar109._24_4_ = auVar104._24_4_ * auVar126._24_4_;
      auVar109._28_4_ = auVar126._28_4_;
      auVar96 = vfmsub231ps_fma(auVar109,auVar125,auVar105);
      auVar199._0_4_ = auVar125._0_4_ * auVar116._0_4_;
      auVar199._4_4_ = auVar125._4_4_ * auVar116._4_4_;
      auVar199._8_4_ = auVar125._8_4_ * auVar116._8_4_;
      auVar199._12_4_ = auVar125._12_4_ * auVar116._12_4_;
      auVar199._16_4_ = fVar221 * auVar116._16_4_;
      auVar199._20_4_ = fVar173 * auVar116._20_4_;
      auVar199._24_4_ = fVar182 * auVar116._24_4_;
      auVar199._28_4_ = 0;
      auVar99 = vfmsub231ps_fma(auVar199,auVar104,auVar124);
      auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar110,auVar118);
      auVar108 = vfmadd231ps_avx512vl(auVar118,auVar110,ZEXT1632(auVar96));
      auVar204 = ZEXT3264(auVar108);
      auVar118 = vmaxps_avx(auVar107,auVar108);
      uVar166 = vcmpps_avx512vl(auVar118,auVar110,2);
      bVar79 = bVar79 & (byte)uVar166;
      if (bVar79 != 0) {
        auVar37._4_4_ = auVar105._4_4_ * auVar119._4_4_;
        auVar37._0_4_ = auVar105._0_4_ * auVar119._0_4_;
        auVar37._8_4_ = auVar105._8_4_ * auVar119._8_4_;
        auVar37._12_4_ = auVar105._12_4_ * auVar119._12_4_;
        auVar37._16_4_ = auVar105._16_4_ * auVar119._16_4_;
        auVar37._20_4_ = auVar105._20_4_ * auVar119._20_4_;
        auVar37._24_4_ = auVar105._24_4_ * auVar119._24_4_;
        auVar37._28_4_ = auVar118._28_4_;
        auVar21 = vfmsub231ps_fma(auVar37,auVar104,auVar117);
        auVar38._4_4_ = auVar117._4_4_ * auVar116._4_4_;
        auVar38._0_4_ = auVar117._0_4_ * auVar116._0_4_;
        auVar38._8_4_ = auVar117._8_4_ * auVar116._8_4_;
        auVar38._12_4_ = auVar117._12_4_ * auVar116._12_4_;
        auVar38._16_4_ = auVar117._16_4_ * auVar116._16_4_;
        auVar38._20_4_ = auVar117._20_4_ * auVar116._20_4_;
        auVar38._24_4_ = auVar117._24_4_ * auVar116._24_4_;
        auVar38._28_4_ = auVar117._28_4_;
        auVar98 = vfmsub231ps_fma(auVar38,auVar106,auVar105);
        auVar39._4_4_ = auVar104._4_4_ * auVar106._4_4_;
        auVar39._0_4_ = auVar104._0_4_ * auVar106._0_4_;
        auVar39._8_4_ = auVar104._8_4_ * auVar106._8_4_;
        auVar39._12_4_ = auVar104._12_4_ * auVar106._12_4_;
        auVar39._16_4_ = auVar104._16_4_ * auVar106._16_4_;
        auVar39._20_4_ = auVar104._20_4_ * auVar106._20_4_;
        auVar39._24_4_ = auVar104._24_4_ * auVar106._24_4_;
        auVar39._28_4_ = auVar104._28_4_;
        auVar92 = vfmsub231ps_fma(auVar39,auVar116,auVar119);
        auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar92));
        auVar99 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar99));
        auVar215 = ZEXT3264(auVar118);
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar30._16_4_ = 0x3f800000;
        auVar30._20_4_ = 0x3f800000;
        auVar30._24_4_ = 0x3f800000;
        auVar30._28_4_ = 0x3f800000;
        auVar119 = vfnmadd213ps_avx512vl(auVar118,ZEXT1632(auVar99),auVar30);
        auVar96 = vfmadd132ps_fma(auVar119,auVar118,auVar118);
        auVar213 = ZEXT1664(auVar96);
        auVar40._4_4_ = auVar92._4_4_ * auVar123._4_4_;
        auVar40._0_4_ = auVar92._0_4_ * auVar123._0_4_;
        auVar40._8_4_ = auVar92._8_4_ * auVar123._8_4_;
        auVar40._12_4_ = auVar92._12_4_ * auVar123._12_4_;
        auVar40._16_4_ = fVar174 * 0.0;
        auVar40._20_4_ = fVar219 * 0.0;
        auVar40._24_4_ = fVar220 * 0.0;
        auVar40._28_4_ = iVar1;
        auVar98 = vfmadd231ps_fma(auVar40,auVar114,ZEXT1632(auVar98));
        auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar115,ZEXT1632(auVar21));
        fVar174 = auVar96._0_4_;
        fVar219 = auVar96._4_4_;
        fVar220 = auVar96._8_4_;
        fVar221 = auVar96._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar98._12_4_ * fVar221,
                                       CONCAT48(auVar98._8_4_ * fVar220,
                                                CONCAT44(auVar98._4_4_ * fVar219,
                                                         auVar98._0_4_ * fVar174))));
        auVar218 = ZEXT3264(local_5a0);
        auVar157._4_4_ = local_560;
        auVar157._0_4_ = local_560;
        auVar157._8_4_ = local_560;
        auVar157._12_4_ = local_560;
        auVar157._16_4_ = local_560;
        auVar157._20_4_ = local_560;
        auVar157._24_4_ = local_560;
        auVar157._28_4_ = local_560;
        uVar166 = vcmpps_avx512vl(auVar157,local_5a0,2);
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar31._4_4_ = uVar165;
        auVar31._0_4_ = uVar165;
        auVar31._8_4_ = uVar165;
        auVar31._12_4_ = uVar165;
        auVar31._16_4_ = uVar165;
        auVar31._20_4_ = uVar165;
        auVar31._24_4_ = uVar165;
        auVar31._28_4_ = uVar165;
        uVar23 = vcmpps_avx512vl(local_5a0,auVar31,2);
        bVar79 = (byte)uVar166 & (byte)uVar23 & bVar79;
        if (bVar79 != 0) {
          uVar81 = vcmpps_avx512vl(ZEXT1632(auVar99),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar81 = bVar79 & uVar81;
          if ((char)uVar81 != '\0') {
            fVar173 = auVar107._0_4_ * fVar174;
            fVar182 = auVar107._4_4_ * fVar219;
            auVar41._4_4_ = fVar182;
            auVar41._0_4_ = fVar173;
            fVar82 = auVar107._8_4_ * fVar220;
            auVar41._8_4_ = fVar82;
            fVar83 = auVar107._12_4_ * fVar221;
            auVar41._12_4_ = fVar83;
            fVar144 = auVar107._16_4_ * 0.0;
            auVar41._16_4_ = fVar144;
            fVar145 = auVar107._20_4_ * 0.0;
            auVar41._20_4_ = fVar145;
            fVar146 = auVar107._24_4_ * 0.0;
            auVar41._24_4_ = fVar146;
            auVar41._28_4_ = auVar107._28_4_;
            auVar158._8_4_ = 0x3f800000;
            auVar158._0_8_ = 0x3f8000003f800000;
            auVar158._12_4_ = 0x3f800000;
            auVar158._16_4_ = 0x3f800000;
            auVar158._20_4_ = 0x3f800000;
            auVar158._24_4_ = 0x3f800000;
            auVar158._28_4_ = 0x3f800000;
            auVar118 = vsubps_avx(auVar158,auVar41);
            local_440._0_4_ =
                 (float)((uint)(bVar71 & 1) * (int)fVar173 |
                        (uint)!(bool)(bVar71 & 1) * auVar118._0_4_);
            bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
            local_440._4_4_ = (float)((uint)bVar13 * (int)fVar182 | (uint)!bVar13 * auVar118._4_4_);
            bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
            local_440._8_4_ = (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar118._8_4_);
            bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
            local_440._12_4_ = (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar118._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
            local_440._16_4_ =
                 (float)((uint)bVar13 * (int)fVar144 | (uint)!bVar13 * auVar118._16_4_);
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            local_440._20_4_ =
                 (float)((uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar118._20_4_);
            bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
            local_440._24_4_ =
                 (float)((uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar118._24_4_);
            bVar13 = SUB81(uVar72 >> 7,0);
            local_440._28_4_ =
                 (float)((uint)bVar13 * auVar107._28_4_ | (uint)!bVar13 * auVar118._28_4_);
            auVar118 = vsubps_avx(ZEXT1632(auVar91),auVar111);
            auVar96 = vfmadd213ps_fma(auVar118,local_440,auVar111);
            uVar165 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
            auVar111._4_4_ = uVar165;
            auVar111._0_4_ = uVar165;
            auVar111._8_4_ = uVar165;
            auVar111._12_4_ = uVar165;
            auVar111._16_4_ = uVar165;
            auVar111._20_4_ = uVar165;
            auVar111._24_4_ = uVar165;
            auVar111._28_4_ = uVar165;
            auVar118 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                          CONCAT48(auVar96._8_4_ + auVar96._8_4_,
                                                                   CONCAT44(auVar96._4_4_ +
                                                                            auVar96._4_4_,
                                                                            auVar96._0_4_ +
                                                                            auVar96._0_4_)))),
                                       auVar111);
            uVar22 = vcmpps_avx512vl(local_5a0,auVar118,6);
            uVar81 = uVar81 & uVar22;
            bVar79 = (byte)uVar81;
            if (bVar79 != 0) {
              auVar180._0_4_ = auVar108._0_4_ * fVar174;
              auVar180._4_4_ = auVar108._4_4_ * fVar219;
              auVar180._8_4_ = auVar108._8_4_ * fVar220;
              auVar180._12_4_ = auVar108._12_4_ * fVar221;
              auVar180._16_4_ = auVar108._16_4_ * 0.0;
              auVar180._20_4_ = auVar108._20_4_ * 0.0;
              auVar180._24_4_ = auVar108._24_4_ * 0.0;
              auVar180._28_4_ = 0;
              auVar188._8_4_ = 0x3f800000;
              auVar188._0_8_ = 0x3f8000003f800000;
              auVar188._12_4_ = 0x3f800000;
              auVar188._16_4_ = 0x3f800000;
              auVar188._20_4_ = 0x3f800000;
              auVar188._24_4_ = 0x3f800000;
              auVar188._28_4_ = 0x3f800000;
              auVar118 = vsubps_avx(auVar188,auVar180);
              auVar129._0_4_ =
                   (uint)(bVar71 & 1) * (int)auVar180._0_4_ |
                   (uint)!(bool)(bVar71 & 1) * auVar118._0_4_;
              bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar129._4_4_ = (uint)bVar13 * (int)auVar180._4_4_ | (uint)!bVar13 * auVar118._4_4_;
              bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar129._8_4_ = (uint)bVar13 * (int)auVar180._8_4_ | (uint)!bVar13 * auVar118._8_4_;
              bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar129._12_4_ =
                   (uint)bVar13 * (int)auVar180._12_4_ | (uint)!bVar13 * auVar118._12_4_;
              bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar129._16_4_ =
                   (uint)bVar13 * (int)auVar180._16_4_ | (uint)!bVar13 * auVar118._16_4_;
              bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar129._20_4_ =
                   (uint)bVar13 * (int)auVar180._20_4_ | (uint)!bVar13 * auVar118._20_4_;
              bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar129._24_4_ =
                   (uint)bVar13 * (int)auVar180._24_4_ | (uint)!bVar13 * auVar118._24_4_;
              auVar129._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar118._28_4_;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_420 = vfmsub132ps_avx512vl(auVar129,auVar188,auVar32);
              local_3e0 = 0;
              local_3d0 = local_670;
              uStack_3c8 = uStack_668;
              local_3c0 = local_680;
              uStack_3b8 = uStack_678;
              local_3b0 = local_690;
              uStack_3a8 = uStack_688;
              local_3a0 = local_6a0;
              uStack_398 = uStack_698;
              if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                fVar174 = 1.0 / auVar112._0_4_;
                local_380[0] = fVar174 * (local_440._0_4_ + 0.0);
                local_380[1] = fVar174 * (local_440._4_4_ + 1.0);
                local_380[2] = fVar174 * (local_440._8_4_ + 2.0);
                local_380[3] = fVar174 * (local_440._12_4_ + 3.0);
                fStack_370 = fVar174 * (local_440._16_4_ + 4.0);
                fStack_36c = fVar174 * (local_440._20_4_ + 5.0);
                fStack_368 = fVar174 * (local_440._24_4_ + 6.0);
                fStack_364 = local_440._28_4_ + 7.0;
                local_360 = local_420;
                local_340 = local_5a0;
                auVar159._8_4_ = 0x7f800000;
                auVar159._0_8_ = 0x7f8000007f800000;
                auVar159._12_4_ = 0x7f800000;
                auVar159._16_4_ = 0x7f800000;
                auVar159._20_4_ = 0x7f800000;
                auVar159._24_4_ = 0x7f800000;
                auVar159._28_4_ = 0x7f800000;
                auVar118 = vblendmps_avx512vl(auVar159,local_5a0);
                auVar130._0_4_ =
                     (uint)(bVar79 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                auVar130._4_4_ = (uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                auVar130._8_4_ = (uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
                auVar130._12_4_ = (uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
                auVar130._16_4_ = (uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
                auVar130._20_4_ = (uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
                auVar130._24_4_ = (uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar81 >> 7,0);
                auVar130._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar118 = vshufps_avx(auVar130,auVar130,0xb1);
                auVar118 = vminps_avx(auVar130,auVar118);
                auVar119 = vshufpd_avx(auVar118,auVar118,5);
                auVar118 = vminps_avx(auVar118,auVar119);
                auVar119 = vpermpd_avx2(auVar118,0x4e);
                auVar118 = vminps_avx(auVar118,auVar119);
                uVar166 = vcmpps_avx512vl(auVar130,auVar118,0);
                uVar73 = (uint)uVar81;
                if ((bVar79 & (byte)uVar166) != 0) {
                  uVar73 = (uint)(bVar79 & (byte)uVar166);
                }
                uVar24 = 0;
                for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar72 = (ulong)uVar24;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_580._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                  local_400 = local_5a0;
                  local_3dc = iVar8;
                  do {
                    fVar174 = local_380[uVar72];
                    auVar171._4_4_ = fVar174;
                    auVar171._0_4_ = fVar174;
                    auVar171._8_4_ = fVar174;
                    auVar171._12_4_ = fVar174;
                    local_1c0._16_4_ = fVar174;
                    local_1c0._0_16_ = auVar171;
                    local_1c0._20_4_ = fVar174;
                    local_1c0._24_4_ = fVar174;
                    local_1c0._28_4_ = fVar174;
                    local_1a0 = *(undefined4 *)(local_360 + uVar72 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar72 * 4);
                    local_660.context = context->user;
                    fVar219 = 1.0 - fVar174;
                    auVar29._8_4_ = 0x80000000;
                    auVar29._0_8_ = 0x8000000080000000;
                    auVar29._12_4_ = 0x80000000;
                    auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar219),auVar29);
                    auVar96 = ZEXT416((uint)(fVar174 * fVar219 * 4.0));
                    auVar99 = vfnmsub213ss_fma(auVar171,auVar171,auVar96);
                    auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),auVar96)
                    ;
                    auVar215 = ZEXT464(0x3f000000);
                    fVar219 = fVar219 * auVar98._0_4_ * 0.5;
                    fVar220 = auVar99._0_4_ * 0.5;
                    fVar221 = auVar96._0_4_ * 0.5;
                    fVar174 = fVar174 * fVar174 * 0.5;
                    auVar209._0_4_ = fVar174 * fVar20;
                    auVar209._4_4_ = fVar174 * fVar62;
                    auVar209._8_4_ = fVar174 * fVar63;
                    auVar209._12_4_ = fVar174 * fVar64;
                    auVar155._4_4_ = fVar221;
                    auVar155._0_4_ = fVar221;
                    auVar155._8_4_ = fVar221;
                    auVar155._12_4_ = fVar221;
                    auVar96 = vfmadd132ps_fma(auVar155,auVar209,auVar93);
                    auVar197._4_4_ = fVar220;
                    auVar197._0_4_ = fVar220;
                    auVar197._8_4_ = fVar220;
                    auVar197._12_4_ = fVar220;
                    auVar96 = vfmadd132ps_fma(auVar197,auVar96,auVar6);
                    auVar156._4_4_ = fVar219;
                    auVar156._0_4_ = fVar219;
                    auVar156._8_4_ = fVar219;
                    auVar156._12_4_ = fVar219;
                    auVar96 = vfmadd132ps_fma(auVar156,auVar96,auVar97);
                    local_220 = auVar96._0_4_;
                    auVar203._8_4_ = 1;
                    auVar203._0_8_ = 0x100000001;
                    auVar203._12_4_ = 1;
                    auVar203._16_4_ = 1;
                    auVar203._20_4_ = 1;
                    auVar203._24_4_ = 1;
                    auVar203._28_4_ = 1;
                    local_200 = vpermps_avx2(auVar203,ZEXT1632(auVar96));
                    auVar204 = ZEXT3264(local_200);
                    auVar210._8_4_ = 2;
                    auVar210._0_8_ = 0x200000002;
                    auVar210._12_4_ = 2;
                    auVar212._16_4_ = 2;
                    auVar212._0_16_ = auVar210;
                    auVar212._20_4_ = 2;
                    auVar212._24_4_ = 2;
                    auVar212._28_4_ = 2;
                    auVar213 = ZEXT3264(auVar212);
                    local_1e0 = vpermps_avx2(auVar212,ZEXT1632(auVar96));
                    iStack_21c = local_220;
                    iStack_218 = local_220;
                    iStack_214 = local_220;
                    iStack_210 = local_220;
                    iStack_20c = local_220;
                    iStack_208 = local_220;
                    iStack_204 = local_220;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_180 = local_2e0._0_8_;
                    uStack_178 = local_2e0._8_8_;
                    uStack_170 = local_2e0._16_8_;
                    uStack_168 = local_2e0._24_8_;
                    local_160 = local_2c0;
                    auVar118 = vpcmpeqd_avx2(local_2c0,local_2c0);
                    local_610[1] = auVar118;
                    *local_610 = auVar118;
                    local_140 = (local_660.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_660.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_600 = local_300;
                    local_660.valid = (int *)local_600;
                    local_660.geometryUserPtr = pGVar77->userPtr;
                    local_660.hit = (RTCHitN *)&local_220;
                    local_660.N = 8;
                    local_660.ray = (RTCRayN *)ray;
                    if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar204 = ZEXT1664(local_200._0_16_);
                      auVar213 = ZEXT1664(auVar210);
                      auVar215 = ZEXT1664(auVar215._0_16_);
                      (*pGVar77->intersectionFilterN)(&local_660);
                      auVar218 = ZEXT3264(local_5a0);
                      auVar236 = ZEXT464(0xbf800000);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar235 = ZEXT1664(auVar96);
                    }
                    if (local_600 == (undefined1  [32])0x0) {
LAB_018ea427:
                      *(undefined4 *)(ray + k * 4 + 0x100) = local_580._0_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar204 = ZEXT1664(auVar204._0_16_);
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        auVar215 = ZEXT1664(auVar215._0_16_);
                        (*p_Var12)(&local_660);
                        auVar218 = ZEXT3264(local_5a0);
                        auVar236 = ZEXT464(0xbf800000);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar235 = ZEXT1664(auVar96);
                      }
                      if (local_600 == (undefined1  [32])0x0) goto LAB_018ea427;
                      uVar22 = vptestmd_avx512vl(local_600,local_600);
                      iVar1 = *(int *)(local_660.hit + 4);
                      iVar2 = *(int *)(local_660.hit + 8);
                      iVar65 = *(int *)(local_660.hit + 0xc);
                      iVar66 = *(int *)(local_660.hit + 0x10);
                      iVar67 = *(int *)(local_660.hit + 0x14);
                      iVar68 = *(int *)(local_660.hit + 0x18);
                      iVar69 = *(int *)(local_660.hit + 0x1c);
                      bVar79 = (byte)uVar22;
                      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                      bVar19 = SUB81(uVar22 >> 7,0);
                      *(uint *)(local_660.ray + 0x180) =
                           (uint)(bVar79 & 1) * *(int *)local_660.hit |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x180);
                      *(uint *)(local_660.ray + 0x184) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                      *(uint *)(local_660.ray + 0x188) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                      *(uint *)(local_660.ray + 0x18c) =
                           (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_660.ray + 0x18c);
                      *(uint *)(local_660.ray + 400) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 400);
                      *(uint *)(local_660.ray + 0x194) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 0x194);
                      *(uint *)(local_660.ray + 0x198) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_660.ray + 0x198);
                      *(uint *)(local_660.ray + 0x19c) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_660.ray + 0x19c);
                      iVar1 = *(int *)(local_660.hit + 0x24);
                      iVar2 = *(int *)(local_660.hit + 0x28);
                      iVar65 = *(int *)(local_660.hit + 0x2c);
                      iVar66 = *(int *)(local_660.hit + 0x30);
                      iVar67 = *(int *)(local_660.hit + 0x34);
                      iVar68 = *(int *)(local_660.hit + 0x38);
                      iVar69 = *(int *)(local_660.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                      bVar19 = SUB81(uVar22 >> 7,0);
                      *(uint *)(local_660.ray + 0x1a0) =
                           (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x20) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1a0);
                      *(uint *)(local_660.ray + 0x1a4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                      *(uint *)(local_660.ray + 0x1a8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                      *(uint *)(local_660.ray + 0x1ac) =
                           (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac);
                      *(uint *)(local_660.ray + 0x1b0) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0);
                      *(uint *)(local_660.ray + 0x1b4) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4);
                      *(uint *)(local_660.ray + 0x1b8) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8);
                      *(uint *)(local_660.ray + 0x1bc) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc);
                      iVar1 = *(int *)(local_660.hit + 0x44);
                      iVar2 = *(int *)(local_660.hit + 0x48);
                      iVar65 = *(int *)(local_660.hit + 0x4c);
                      iVar66 = *(int *)(local_660.hit + 0x50);
                      iVar67 = *(int *)(local_660.hit + 0x54);
                      iVar68 = *(int *)(local_660.hit + 0x58);
                      iVar69 = *(int *)(local_660.hit + 0x5c);
                      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                      bVar19 = SUB81(uVar22 >> 7,0);
                      *(uint *)(local_660.ray + 0x1c0) =
                           (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x40) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1c0);
                      *(uint *)(local_660.ray + 0x1c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                      *(uint *)(local_660.ray + 0x1c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                      *(uint *)(local_660.ray + 0x1cc) =
                           (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc);
                      *(uint *)(local_660.ray + 0x1d0) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0);
                      *(uint *)(local_660.ray + 0x1d4) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4);
                      *(uint *)(local_660.ray + 0x1d8) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8);
                      *(uint *)(local_660.ray + 0x1dc) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc);
                      iVar1 = *(int *)(local_660.hit + 100);
                      iVar2 = *(int *)(local_660.hit + 0x68);
                      iVar65 = *(int *)(local_660.hit + 0x6c);
                      iVar66 = *(int *)(local_660.hit + 0x70);
                      iVar67 = *(int *)(local_660.hit + 0x74);
                      iVar68 = *(int *)(local_660.hit + 0x78);
                      iVar69 = *(int *)(local_660.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                      bVar19 = SUB81(uVar22 >> 7,0);
                      *(uint *)(local_660.ray + 0x1e0) =
                           (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x60) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1e0);
                      *(uint *)(local_660.ray + 0x1e4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                      *(uint *)(local_660.ray + 0x1e8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                      *(uint *)(local_660.ray + 0x1ec) =
                           (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec);
                      *(uint *)(local_660.ray + 0x1f0) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0);
                      *(uint *)(local_660.ray + 500) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 500);
                      *(uint *)(local_660.ray + 0x1f8) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8);
                      *(uint *)(local_660.ray + 0x1fc) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc);
                      iVar1 = *(int *)(local_660.hit + 0x84);
                      iVar2 = *(int *)(local_660.hit + 0x88);
                      iVar65 = *(int *)(local_660.hit + 0x8c);
                      iVar66 = *(int *)(local_660.hit + 0x90);
                      iVar67 = *(int *)(local_660.hit + 0x94);
                      iVar68 = *(int *)(local_660.hit + 0x98);
                      iVar69 = *(int *)(local_660.hit + 0x9c);
                      bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                      bVar19 = SUB81(uVar22 >> 7,0);
                      *(uint *)(local_660.ray + 0x200) =
                           (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x80) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x200);
                      *(uint *)(local_660.ray + 0x204) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                      *(uint *)(local_660.ray + 0x208) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                      *(uint *)(local_660.ray + 0x20c) =
                           (uint)bVar15 * iVar65 | (uint)!bVar15 * *(int *)(local_660.ray + 0x20c);
                      *(uint *)(local_660.ray + 0x210) =
                           (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 0x210);
                      *(uint *)(local_660.ray + 0x214) =
                           (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 0x214);
                      *(uint *)(local_660.ray + 0x218) =
                           (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_660.ray + 0x218);
                      *(uint *)(local_660.ray + 0x21c) =
                           (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_660.ray + 0x21c);
                      auVar118 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0));
                      *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar118;
                      auVar118 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0));
                      *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar118;
                      auVar118 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0));
                      *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar118;
                      auVar118 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0x100));
                      *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar118;
                      local_580._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_580._4_4_ = 0;
                      local_580._8_4_ = 0;
                      local_580._12_4_ = 0;
                    }
                    bVar79 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar81;
                    auVar163._4_4_ = local_580._0_4_;
                    auVar163._0_4_ = local_580._0_4_;
                    auVar163._8_4_ = local_580._0_4_;
                    auVar163._12_4_ = local_580._0_4_;
                    auVar163._16_4_ = local_580._0_4_;
                    auVar163._20_4_ = local_580._0_4_;
                    auVar163._24_4_ = local_580._0_4_;
                    auVar163._28_4_ = local_580._0_4_;
                    uVar166 = vcmpps_avx512vl(auVar218._0_32_,auVar163,2);
                    if ((bVar79 & (byte)uVar166) == 0) goto LAB_018e939c;
                    bVar79 = bVar79 & (byte)uVar166;
                    uVar81 = (ulong)bVar79;
                    auVar164._8_4_ = 0x7f800000;
                    auVar164._0_8_ = 0x7f8000007f800000;
                    auVar164._12_4_ = 0x7f800000;
                    auVar164._16_4_ = 0x7f800000;
                    auVar164._20_4_ = 0x7f800000;
                    auVar164._24_4_ = 0x7f800000;
                    auVar164._28_4_ = 0x7f800000;
                    auVar118 = vblendmps_avx512vl(auVar164,auVar218._0_32_);
                    auVar143._0_4_ =
                         (uint)(bVar79 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 1 & 1);
                    auVar143._4_4_ = (uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 2 & 1);
                    auVar143._8_4_ = (uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 3 & 1);
                    auVar143._12_4_ = (uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 4 & 1);
                    auVar143._16_4_ = (uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 5 & 1);
                    auVar143._20_4_ = (uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar79 >> 6 & 1);
                    auVar143._24_4_ = (uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar143._28_4_ =
                         (uint)(bVar79 >> 7) * auVar118._28_4_ |
                         (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                    auVar118 = vshufps_avx(auVar143,auVar143,0xb1);
                    auVar118 = vminps_avx(auVar143,auVar118);
                    auVar119 = vshufpd_avx(auVar118,auVar118,5);
                    auVar118 = vminps_avx(auVar118,auVar119);
                    auVar119 = vpermpd_avx2(auVar118,0x4e);
                    auVar118 = vminps_avx(auVar118,auVar119);
                    uVar166 = vcmpps_avx512vl(auVar143,auVar118,0);
                    bVar71 = (byte)uVar166 & bVar79;
                    if (bVar71 != 0) {
                      bVar79 = bVar71;
                    }
                    uVar80 = 0;
                    for (uVar73 = (uint)bVar79; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000
                        ) {
                      uVar80 = uVar80 + 1;
                    }
                    uVar72 = (ulong)uVar80;
                  } while( true );
                }
                fVar174 = local_380[uVar72];
                uVar165 = *(undefined4 *)(local_360 + uVar72 * 4);
                fVar219 = 1.0 - fVar174;
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar219),auVar25);
                auVar96 = ZEXT416((uint)(fVar174 * fVar219 * 4.0));
                auVar99 = vfnmsub213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),auVar96);
                fVar219 = fVar219 * auVar98._0_4_ * 0.5;
                fVar220 = auVar99._0_4_ * 0.5;
                auVar213 = ZEXT464((uint)fVar220);
                fVar221 = auVar96._0_4_ * 0.5;
                fVar173 = fVar174 * fVar174 * 0.5;
                auVar192._0_4_ = fVar173 * fVar20;
                auVar192._4_4_ = fVar173 * fVar62;
                auVar192._8_4_ = fVar173 * fVar63;
                auVar192._12_4_ = fVar173 * fVar64;
                auVar176._4_4_ = fVar221;
                auVar176._0_4_ = fVar221;
                auVar176._8_4_ = fVar221;
                auVar176._12_4_ = fVar221;
                auVar96 = vfmadd132ps_fma(auVar176,auVar192,auVar93);
                auVar193._4_4_ = fVar220;
                auVar193._0_4_ = fVar220;
                auVar193._8_4_ = fVar220;
                auVar193._12_4_ = fVar220;
                auVar96 = vfmadd132ps_fma(auVar193,auVar96,auVar6);
                auVar204 = ZEXT1664(auVar96);
                auVar177._4_4_ = fVar219;
                auVar177._0_4_ = fVar219;
                auVar177._8_4_ = fVar219;
                auVar177._12_4_ = fVar219;
                auVar96 = vfmadd132ps_fma(auVar177,auVar96,auVar97);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar72 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar96._0_4_;
                uVar9 = vextractps_avx(auVar96,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                uVar9 = vextractps_avx(auVar96,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar165;
                *(uint *)(ray + k * 4 + 0x220) = uVar80;
                *(uint *)(ray + k * 4 + 0x240) = uVar7;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_018e939c:
    if (8 < iVar8) {
      local_580 = vpbroadcastd_avx512vl();
      local_5a0._4_4_ = local_630._0_4_;
      local_5a0._0_4_ = local_630._0_4_;
      local_5a0._8_4_ = local_630._0_4_;
      local_5a0._12_4_ = local_630._0_4_;
      local_5a0._16_4_ = local_630._0_4_;
      local_5a0._20_4_ = local_630._0_4_;
      local_5a0._24_4_ = local_630._0_4_;
      local_5a0._28_4_ = local_630._0_4_;
      uStack_55c = local_560;
      uStack_558 = local_560;
      uStack_554 = local_560;
      uStack_550 = local_560;
      uStack_54c = local_560;
      uStack_548 = local_560;
      uStack_544 = local_560;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar75 = 8;
LAB_018e942c:
      if (lVar75 < iVar8) {
        auVar118 = vpbroadcastd_avx512vl();
        auVar118 = vpor_avx2(auVar118,_DAT_01fb4ba0);
        uVar23 = vpcmpd_avx512vl(auVar118,local_580,1);
        auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar75 * 4 + lVar78);
        auVar119 = *(undefined1 (*) [32])(lVar78 + 0x21fffac + lVar75 * 4);
        auVar117 = *(undefined1 (*) [32])(lVar78 + 0x2200430 + lVar75 * 4);
        auVar116 = *(undefined1 (*) [32])(lVar78 + 0x22008b4 + lVar75 * 4);
        fVar174 = auVar116._0_4_;
        auVar218._0_4_ = fVar174 * (float)local_520._0_4_;
        fVar219 = auVar116._4_4_;
        auVar218._4_4_ = fVar219 * (float)local_520._4_4_;
        fVar220 = auVar116._8_4_;
        auVar218._8_4_ = fVar220 * fStack_518;
        fVar221 = auVar116._12_4_;
        auVar218._12_4_ = fVar221 * fStack_514;
        fVar173 = auVar116._16_4_;
        auVar218._16_4_ = fVar173 * fStack_510;
        fVar182 = auVar116._20_4_;
        auVar218._20_4_ = fVar182 * fStack_50c;
        auVar218._28_36_ = auVar213._28_36_;
        fVar82 = auVar116._24_4_;
        auVar218._24_4_ = fVar82 * fStack_508;
        auVar213._0_4_ = fVar174 * (float)local_540._0_4_;
        auVar213._4_4_ = fVar219 * (float)local_540._4_4_;
        auVar213._8_4_ = fVar220 * fStack_538;
        auVar213._12_4_ = fVar221 * fStack_534;
        auVar213._16_4_ = fVar173 * fStack_530;
        auVar213._20_4_ = fVar182 * fStack_52c;
        auVar213._28_36_ = auVar204._28_36_;
        auVar213._24_4_ = fVar82 * fStack_528;
        auVar104 = vmulps_avx512vl(local_e0,auVar116);
        auVar105 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar117,local_4e0);
        auVar115 = vfmadd231ps_avx512vl(auVar213._0_32_,auVar117,local_500);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar117,local_c0);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar119,local_4a0);
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_4c0);
        auVar114 = vfmadd231ps_avx512vl(auVar104,auVar119,local_a0);
        auVar96 = vfmadd231ps_fma(auVar105,auVar118,local_460);
        auVar213 = ZEXT1664(auVar96);
        auVar99 = vfmadd231ps_fma(auVar115,auVar118,local_480);
        auVar204 = ZEXT1664(auVar99);
        auVar104 = *(undefined1 (*) [32])(bspline_basis1 + lVar75 * 4 + lVar78);
        auVar105 = *(undefined1 (*) [32])(lVar78 + 0x22023cc + lVar75 * 4);
        auVar107 = vfmadd231ps_avx512vl(auVar114,auVar118,local_80);
        auVar115 = *(undefined1 (*) [32])(lVar78 + 0x2202850 + lVar75 * 4);
        auVar114 = *(undefined1 (*) [32])(lVar78 + 0x2202cd4 + lVar75 * 4);
        fVar83 = auVar114._0_4_;
        auVar216._0_4_ = fVar83 * (float)local_520._0_4_;
        fVar144 = auVar114._4_4_;
        auVar216._4_4_ = fVar144 * (float)local_520._4_4_;
        fVar145 = auVar114._8_4_;
        auVar216._8_4_ = fVar145 * fStack_518;
        fVar146 = auVar114._12_4_;
        auVar216._12_4_ = fVar146 * fStack_514;
        fVar147 = auVar114._16_4_;
        auVar216._16_4_ = fVar147 * fStack_510;
        fVar149 = auVar114._20_4_;
        auVar216._20_4_ = fVar149 * fStack_50c;
        auVar216._28_36_ = auVar215._28_36_;
        fVar150 = auVar114._24_4_;
        auVar216._24_4_ = fVar150 * fStack_508;
        auVar42._4_4_ = fVar144 * (float)local_540._4_4_;
        auVar42._0_4_ = fVar83 * (float)local_540._0_4_;
        auVar42._8_4_ = fVar145 * fStack_538;
        auVar42._12_4_ = fVar146 * fStack_534;
        auVar42._16_4_ = fVar147 * fStack_530;
        auVar42._20_4_ = fVar149 * fStack_52c;
        auVar42._24_4_ = fVar150 * fStack_528;
        auVar42._28_4_ = uStack_524;
        auVar106 = vmulps_avx512vl(local_e0,auVar114);
        auVar108 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar115,local_4e0);
        auVar109 = vfmadd231ps_avx512vl(auVar42,auVar115,local_500);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar115,local_c0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar105,local_4a0);
        auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,local_4c0);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,local_a0);
        auVar98 = vfmadd231ps_fma(auVar108,auVar104,local_460);
        auVar215 = ZEXT1664(auVar98);
        auVar21 = vfmadd231ps_fma(auVar109,auVar104,local_480);
        auVar108 = vfmadd231ps_avx512vl(auVar106,auVar104,local_80);
        auVar109 = vmaxps_avx512vl(auVar107,auVar108);
        auVar106 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar96));
        auVar110 = vsubps_avx512vl(ZEXT1632(auVar21),ZEXT1632(auVar99));
        auVar111 = vmulps_avx512vl(ZEXT1632(auVar99),auVar106);
        auVar112 = vmulps_avx512vl(ZEXT1632(auVar96),auVar110);
        auVar111 = vsubps_avx512vl(auVar111,auVar112);
        auVar112 = vmulps_avx512vl(auVar110,auVar110);
        auVar112 = vfmadd231ps_avx512vl(auVar112,auVar106,auVar106);
        auVar109 = vmulps_avx512vl(auVar109,auVar109);
        auVar109 = vmulps_avx512vl(auVar109,auVar112);
        auVar111 = vmulps_avx512vl(auVar111,auVar111);
        uVar166 = vcmpps_avx512vl(auVar111,auVar109,2);
        bVar79 = (byte)uVar23 & (byte)uVar166;
        if (bVar79 != 0) {
          fVar148 = local_2a0._0_4_;
          fVar151 = local_2a0._4_4_;
          auVar43._4_4_ = fVar151 * fVar144;
          auVar43._0_4_ = fVar148 * fVar83;
          fVar83 = local_2a0._8_4_;
          auVar43._8_4_ = fVar83 * fVar145;
          fVar144 = local_2a0._12_4_;
          auVar43._12_4_ = fVar144 * fVar146;
          fVar145 = local_2a0._16_4_;
          auVar43._16_4_ = fVar145 * fVar147;
          fVar146 = local_2a0._20_4_;
          auVar43._20_4_ = fVar146 * fVar149;
          fVar147 = local_2a0._24_4_;
          auVar43._24_4_ = fVar147 * fVar150;
          auVar43._28_4_ = auVar114._28_4_;
          auVar115 = vfmadd213ps_avx512vl(auVar115,local_280,auVar43);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_260,auVar115);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_240,auVar105);
          auVar44._4_4_ = fVar151 * fVar219;
          auVar44._0_4_ = fVar148 * fVar174;
          auVar44._8_4_ = fVar83 * fVar220;
          auVar44._12_4_ = fVar144 * fVar221;
          auVar44._16_4_ = fVar145 * fVar173;
          auVar44._20_4_ = fVar146 * fVar182;
          auVar44._24_4_ = fVar147 * fVar82;
          auVar44._28_4_ = auVar116._28_4_;
          auVar117 = vfmadd213ps_avx512vl(auVar117,local_280,auVar44);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_260,auVar117);
          auVar105 = vfmadd213ps_avx512vl(auVar118,local_240,auVar119);
          auVar118 = *(undefined1 (*) [32])(lVar78 + 0x2200d38 + lVar75 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar78 + 0x22011bc + lVar75 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar78 + 0x2201640 + lVar75 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar78 + 0x2201ac4 + lVar75 * 4);
          auVar115 = vmulps_avx512vl(_local_520,auVar116);
          auVar114 = vmulps_avx512vl(_local_540,auVar116);
          auVar45._4_4_ = fVar151 * auVar116._4_4_;
          auVar45._0_4_ = fVar148 * auVar116._0_4_;
          auVar45._8_4_ = fVar83 * auVar116._8_4_;
          auVar45._12_4_ = fVar144 * auVar116._12_4_;
          auVar45._16_4_ = fVar145 * auVar116._16_4_;
          auVar45._20_4_ = fVar146 * auVar116._20_4_;
          auVar45._24_4_ = fVar147 * auVar116._24_4_;
          auVar45._28_4_ = auVar116._28_4_;
          auVar116 = vfmadd231ps_avx512vl(auVar115,auVar117,local_4e0);
          auVar115 = vfmadd231ps_avx512vl(auVar114,auVar117,local_500);
          auVar117 = vfmadd231ps_avx512vl(auVar45,local_280,auVar117);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar119,local_4a0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar119,local_4c0);
          auVar119 = vfmadd231ps_avx512vl(auVar117,local_260,auVar119);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_460);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar118,local_480);
          auVar114 = vfmadd231ps_avx512vl(auVar119,local_240,auVar118);
          auVar118 = *(undefined1 (*) [32])(lVar78 + 0x2203158 + lVar75 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar78 + 0x2203a60 + lVar75 * 4);
          auVar117 = *(undefined1 (*) [32])(lVar78 + 0x2203ee4 + lVar75 * 4);
          auVar109 = vmulps_avx512vl(_local_520,auVar117);
          auVar111 = vmulps_avx512vl(_local_540,auVar117);
          auVar117 = vmulps_avx512vl(local_2a0,auVar117);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar119,local_4e0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_500);
          auVar117 = vfmadd231ps_avx512vl(auVar117,local_280,auVar119);
          auVar235 = ZEXT1664(auVar235._0_16_);
          auVar119 = *(undefined1 (*) [32])(lVar78 + 0x22035dc + lVar75 * 4);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar119,local_4a0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar119,local_4c0);
          auVar119 = vfmadd231ps_avx512vl(auVar117,local_260,auVar119);
          auVar236 = ZEXT1664(auVar236._0_16_);
          auVar117 = vfmadd231ps_avx512vl(auVar109,auVar118,local_460);
          auVar109 = vfmadd231ps_avx512vl(auVar111,auVar118,local_480);
          auVar119 = vfmadd231ps_avx512vl(auVar119,local_240,auVar118);
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar116,auVar111);
          vandps_avx512vl(auVar115,auVar111);
          auVar118 = vmaxps_avx(auVar111,auVar111);
          vandps_avx512vl(auVar114,auVar111);
          auVar118 = vmaxps_avx(auVar118,auVar111);
          uVar72 = vcmpps_avx512vl(auVar118,local_5a0,1);
          bVar13 = (bool)((byte)uVar72 & 1);
          auVar131._0_4_ = (float)((uint)bVar13 * auVar106._0_4_ | (uint)!bVar13 * auVar116._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar131._4_4_ = (float)((uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar116._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar131._8_4_ = (float)((uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar116._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar131._12_4_ =
               (float)((uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar116._12_4_);
          bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar131._16_4_ =
               (float)((uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * auVar116._16_4_);
          bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar131._20_4_ =
               (float)((uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * auVar116._20_4_);
          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar131._24_4_ =
               (float)((uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * auVar116._24_4_);
          bVar13 = SUB81(uVar72 >> 7,0);
          auVar131._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * auVar116._28_4_;
          bVar13 = (bool)((byte)uVar72 & 1);
          auVar132._0_4_ = (float)((uint)bVar13 * auVar110._0_4_ | (uint)!bVar13 * auVar115._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar115._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar115._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar132._12_4_ =
               (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar115._12_4_);
          bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar132._16_4_ =
               (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar115._16_4_);
          bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar132._20_4_ =
               (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar115._20_4_);
          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar132._24_4_ =
               (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar115._24_4_);
          bVar13 = SUB81(uVar72 >> 7,0);
          auVar132._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar115._28_4_;
          vandps_avx512vl(auVar117,auVar111);
          vandps_avx512vl(auVar109,auVar111);
          auVar118 = vmaxps_avx(auVar132,auVar132);
          vandps_avx512vl(auVar119,auVar111);
          auVar118 = vmaxps_avx(auVar118,auVar132);
          uVar72 = vcmpps_avx512vl(auVar118,local_5a0,1);
          bVar13 = (bool)((byte)uVar72 & 1);
          auVar133._0_4_ = (uint)bVar13 * auVar106._0_4_ | (uint)!bVar13 * auVar117._0_4_;
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar133._4_4_ = (uint)bVar13 * auVar106._4_4_ | (uint)!bVar13 * auVar117._4_4_;
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar133._8_4_ = (uint)bVar13 * auVar106._8_4_ | (uint)!bVar13 * auVar117._8_4_;
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar133._12_4_ = (uint)bVar13 * auVar106._12_4_ | (uint)!bVar13 * auVar117._12_4_;
          bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar133._16_4_ = (uint)bVar13 * auVar106._16_4_ | (uint)!bVar13 * auVar117._16_4_;
          bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar133._20_4_ = (uint)bVar13 * auVar106._20_4_ | (uint)!bVar13 * auVar117._20_4_;
          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar133._24_4_ = (uint)bVar13 * auVar106._24_4_ | (uint)!bVar13 * auVar117._24_4_;
          bVar13 = SUB81(uVar72 >> 7,0);
          auVar133._28_4_ = (uint)bVar13 * auVar106._28_4_ | (uint)!bVar13 * auVar117._28_4_;
          bVar13 = (bool)((byte)uVar72 & 1);
          auVar134._0_4_ = (float)((uint)bVar13 * auVar110._0_4_ | (uint)!bVar13 * auVar109._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar109._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar109._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar109._12_4_);
          bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar134._16_4_ =
               (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar109._16_4_);
          bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar134._20_4_ =
               (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar109._20_4_);
          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar134._24_4_ =
               (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar109._24_4_);
          bVar13 = SUB81(uVar72 >> 7,0);
          auVar134._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar109._28_4_;
          auVar223._8_4_ = 0x80000000;
          auVar223._0_8_ = 0x8000000080000000;
          auVar223._12_4_ = 0x80000000;
          auVar223._16_4_ = 0x80000000;
          auVar223._20_4_ = 0x80000000;
          auVar223._24_4_ = 0x80000000;
          auVar223._28_4_ = 0x80000000;
          auVar118 = vxorps_avx512vl(auVar133,auVar223);
          auVar103 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
          auVar119 = vfmadd213ps_avx512vl(auVar131,auVar131,ZEXT1632(auVar103));
          auVar92 = vfmadd231ps_fma(auVar119,auVar132,auVar132);
          auVar119 = vrsqrt14ps_avx512vl(ZEXT1632(auVar92));
          auVar233._8_4_ = 0xbf000000;
          auVar233._0_8_ = 0xbf000000bf000000;
          auVar233._12_4_ = 0xbf000000;
          auVar233._16_4_ = 0xbf000000;
          auVar233._20_4_ = 0xbf000000;
          auVar233._24_4_ = 0xbf000000;
          auVar233._28_4_ = 0xbf000000;
          fVar174 = auVar119._0_4_;
          fVar219 = auVar119._4_4_;
          fVar220 = auVar119._8_4_;
          fVar221 = auVar119._12_4_;
          fVar173 = auVar119._16_4_;
          fVar182 = auVar119._20_4_;
          fVar82 = auVar119._24_4_;
          auVar46._4_4_ = fVar219 * fVar219 * fVar219 * auVar92._4_4_ * -0.5;
          auVar46._0_4_ = fVar174 * fVar174 * fVar174 * auVar92._0_4_ * -0.5;
          auVar46._8_4_ = fVar220 * fVar220 * fVar220 * auVar92._8_4_ * -0.5;
          auVar46._12_4_ = fVar221 * fVar221 * fVar221 * auVar92._12_4_ * -0.5;
          auVar46._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar46._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
          auVar46._24_4_ = fVar82 * fVar82 * fVar82 * -0.0;
          auVar46._28_4_ = auVar132._28_4_;
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar119 = vfmadd231ps_avx512vl(auVar46,auVar117,auVar119);
          auVar47._4_4_ = auVar132._4_4_ * auVar119._4_4_;
          auVar47._0_4_ = auVar132._0_4_ * auVar119._0_4_;
          auVar47._8_4_ = auVar132._8_4_ * auVar119._8_4_;
          auVar47._12_4_ = auVar132._12_4_ * auVar119._12_4_;
          auVar47._16_4_ = auVar132._16_4_ * auVar119._16_4_;
          auVar47._20_4_ = auVar132._20_4_ * auVar119._20_4_;
          auVar47._24_4_ = auVar132._24_4_ * auVar119._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar119._4_4_ * -auVar131._4_4_;
          auVar48._0_4_ = auVar119._0_4_ * -auVar131._0_4_;
          auVar48._8_4_ = auVar119._8_4_ * -auVar131._8_4_;
          auVar48._12_4_ = auVar119._12_4_ * -auVar131._12_4_;
          auVar48._16_4_ = auVar119._16_4_ * -auVar131._16_4_;
          auVar48._20_4_ = auVar119._20_4_ * -auVar131._20_4_;
          auVar48._24_4_ = auVar119._24_4_ * -auVar131._24_4_;
          auVar48._28_4_ = auVar132._28_4_;
          auVar116 = vmulps_avx512vl(auVar119,ZEXT1632(auVar103));
          auVar114 = ZEXT1632(auVar103);
          auVar119 = vfmadd213ps_avx512vl(auVar133,auVar133,auVar114);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar134,auVar134);
          auVar115 = vrsqrt14ps_avx512vl(auVar119);
          auVar119 = vmulps_avx512vl(auVar119,auVar233);
          fVar174 = auVar115._0_4_;
          fVar219 = auVar115._4_4_;
          fVar220 = auVar115._8_4_;
          fVar221 = auVar115._12_4_;
          fVar173 = auVar115._16_4_;
          fVar182 = auVar115._20_4_;
          fVar82 = auVar115._24_4_;
          auVar49._4_4_ = fVar219 * fVar219 * fVar219 * auVar119._4_4_;
          auVar49._0_4_ = fVar174 * fVar174 * fVar174 * auVar119._0_4_;
          auVar49._8_4_ = fVar220 * fVar220 * fVar220 * auVar119._8_4_;
          auVar49._12_4_ = fVar221 * fVar221 * fVar221 * auVar119._12_4_;
          auVar49._16_4_ = fVar173 * fVar173 * fVar173 * auVar119._16_4_;
          auVar49._20_4_ = fVar182 * fVar182 * fVar182 * auVar119._20_4_;
          auVar49._24_4_ = fVar82 * fVar82 * fVar82 * auVar119._24_4_;
          auVar49._28_4_ = auVar119._28_4_;
          auVar119 = vfmadd231ps_avx512vl(auVar49,auVar117,auVar115);
          auVar50._4_4_ = auVar134._4_4_ * auVar119._4_4_;
          auVar50._0_4_ = auVar134._0_4_ * auVar119._0_4_;
          auVar50._8_4_ = auVar134._8_4_ * auVar119._8_4_;
          auVar50._12_4_ = auVar134._12_4_ * auVar119._12_4_;
          auVar50._16_4_ = auVar134._16_4_ * auVar119._16_4_;
          auVar50._20_4_ = auVar134._20_4_ * auVar119._20_4_;
          auVar50._24_4_ = auVar134._24_4_ * auVar119._24_4_;
          auVar50._28_4_ = auVar115._28_4_;
          auVar51._4_4_ = auVar119._4_4_ * auVar118._4_4_;
          auVar51._0_4_ = auVar119._0_4_ * auVar118._0_4_;
          auVar51._8_4_ = auVar119._8_4_ * auVar118._8_4_;
          auVar51._12_4_ = auVar119._12_4_ * auVar118._12_4_;
          auVar51._16_4_ = auVar119._16_4_ * auVar118._16_4_;
          auVar51._20_4_ = auVar119._20_4_ * auVar118._20_4_;
          auVar51._24_4_ = auVar119._24_4_ * auVar118._24_4_;
          auVar51._28_4_ = auVar118._28_4_;
          auVar118 = vmulps_avx512vl(auVar119,auVar114);
          auVar92 = vfmadd213ps_fma(auVar47,auVar107,ZEXT1632(auVar96));
          auVar88 = vfmadd213ps_fma(auVar48,auVar107,ZEXT1632(auVar99));
          auVar117 = vfmadd213ps_avx512vl(auVar116,auVar107,auVar105);
          auVar115 = vfmadd213ps_avx512vl(auVar50,auVar108,ZEXT1632(auVar98));
          auVar90 = vfnmadd213ps_fma(auVar47,auVar107,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar51,auVar108,ZEXT1632(auVar21));
          auVar91 = vfnmadd213ps_fma(auVar48,auVar107,ZEXT1632(auVar99));
          auVar99 = vfmadd213ps_fma(auVar118,auVar108,auVar104);
          auVar234 = vfnmadd231ps_fma(auVar105,auVar107,auVar116);
          auVar94 = vfnmadd213ps_fma(auVar50,auVar108,ZEXT1632(auVar98));
          auVar95 = vfnmadd213ps_fma(auVar51,auVar108,ZEXT1632(auVar21));
          auVar102 = vfnmadd231ps_fma(auVar104,auVar108,auVar118);
          auVar104 = vsubps_avx512vl(auVar115,ZEXT1632(auVar90));
          auVar118 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar91));
          auVar119 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar234));
          auVar52._4_4_ = auVar118._4_4_ * auVar234._4_4_;
          auVar52._0_4_ = auVar118._0_4_ * auVar234._0_4_;
          auVar52._8_4_ = auVar118._8_4_ * auVar234._8_4_;
          auVar52._12_4_ = auVar118._12_4_ * auVar234._12_4_;
          auVar52._16_4_ = auVar118._16_4_ * 0.0;
          auVar52._20_4_ = auVar118._20_4_ * 0.0;
          auVar52._24_4_ = auVar118._24_4_ * 0.0;
          auVar52._28_4_ = auVar116._28_4_;
          auVar98 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar91),auVar119);
          auVar53._4_4_ = auVar119._4_4_ * auVar90._4_4_;
          auVar53._0_4_ = auVar119._0_4_ * auVar90._0_4_;
          auVar53._8_4_ = auVar119._8_4_ * auVar90._8_4_;
          auVar53._12_4_ = auVar119._12_4_ * auVar90._12_4_;
          auVar53._16_4_ = auVar119._16_4_ * 0.0;
          auVar53._20_4_ = auVar119._20_4_ * 0.0;
          auVar53._24_4_ = auVar119._24_4_ * 0.0;
          auVar53._28_4_ = auVar119._28_4_;
          auVar21 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar234),auVar104);
          auVar54._4_4_ = auVar91._4_4_ * auVar104._4_4_;
          auVar54._0_4_ = auVar91._0_4_ * auVar104._0_4_;
          auVar54._8_4_ = auVar91._8_4_ * auVar104._8_4_;
          auVar54._12_4_ = auVar91._12_4_ * auVar104._12_4_;
          auVar54._16_4_ = auVar104._16_4_ * 0.0;
          auVar54._20_4_ = auVar104._20_4_ * 0.0;
          auVar54._24_4_ = auVar104._24_4_ * 0.0;
          auVar54._28_4_ = auVar104._28_4_;
          auVar89 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar90),auVar118);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar114,ZEXT1632(auVar21));
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar114,ZEXT1632(auVar98));
          auVar111 = ZEXT1632(auVar103);
          uVar72 = vcmpps_avx512vl(auVar118,auVar111,2);
          bVar71 = (byte)uVar72;
          fVar145 = (float)((uint)(bVar71 & 1) * auVar92._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar94._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar147 = (float)((uint)bVar13 * auVar92._4_4_ | (uint)!bVar13 * auVar94._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar150 = (float)((uint)bVar13 * auVar92._8_4_ | (uint)!bVar13 * auVar94._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar151 = (float)((uint)bVar13 * auVar92._12_4_ | (uint)!bVar13 * auVar94._12_4_);
          auVar114 = ZEXT1632(CONCAT412(fVar151,CONCAT48(fVar150,CONCAT44(fVar147,fVar145))));
          fVar146 = (float)((uint)(bVar71 & 1) * auVar88._0_4_ |
                           (uint)!(bool)(bVar71 & 1) * auVar95._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar149 = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar95._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar148 = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar95._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar152 = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar95._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar152,CONCAT48(fVar148,CONCAT44(fVar149,fVar146))));
          auVar135._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar102._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar102._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar102._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar102._12_4_);
          fVar174 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar117._16_4_);
          auVar135._16_4_ = fVar174;
          fVar219 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar117._20_4_);
          auVar135._20_4_ = fVar219;
          fVar220 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar117._24_4_);
          auVar135._24_4_ = fVar220;
          iVar1 = (uint)(byte)(uVar72 >> 7) * auVar117._28_4_;
          auVar135._28_4_ = iVar1;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar90),auVar115);
          auVar136._0_4_ =
               (uint)(bVar71 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar98._0_4_;
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar98._4_4_;
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar98._8_4_;
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar98._12_4_;
          auVar136._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar118._16_4_;
          auVar136._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar118._20_4_;
          auVar136._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar118._24_4_;
          auVar136._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar118._28_4_;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar96));
          auVar137._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar118._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar92._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar92._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar92._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar137._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar92._12_4_)
          ;
          fVar182 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar118._16_4_);
          auVar137._16_4_ = fVar182;
          fVar173 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar118._20_4_);
          auVar137._20_4_ = fVar173;
          fVar221 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar118._24_4_);
          auVar137._24_4_ = fVar221;
          auVar137._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar118._28_4_;
          auVar118 = vblendmps_avx512vl(ZEXT1632(auVar234),ZEXT1632(auVar99));
          auVar138._0_4_ =
               (float)((uint)(bVar71 & 1) * auVar118._0_4_ |
                      (uint)!(bool)(bVar71 & 1) * auVar88._0_4_);
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * auVar88._4_4_);
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * auVar88._8_4_);
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar138._12_4_ = (float)((uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * auVar88._12_4_)
          ;
          fVar144 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar118._16_4_);
          auVar138._16_4_ = fVar144;
          fVar83 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar118._20_4_);
          auVar138._20_4_ = fVar83;
          fVar82 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar118._24_4_);
          auVar138._24_4_ = fVar82;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar118._28_4_;
          auVar138._28_4_ = iVar2;
          auVar139._0_4_ =
               (uint)(bVar71 & 1) * (int)auVar90._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar115._0_4_;
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar13 * (int)auVar90._4_4_ | (uint)!bVar13 * auVar115._4_4_;
          bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar13 * (int)auVar90._8_4_ | (uint)!bVar13 * auVar115._8_4_;
          bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar13 * (int)auVar90._12_4_ | (uint)!bVar13 * auVar115._12_4_;
          auVar139._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar115._16_4_;
          auVar139._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar115._20_4_;
          auVar139._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar115._24_4_;
          auVar139._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar115._28_4_;
          bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar115 = vsubps_avx512vl(auVar139,auVar114);
          auVar119 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar91._12_4_ |
                                                   (uint)!bVar17 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar91._8_4_ |
                                                            (uint)!bVar15 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar91._4_4_ |
                                                                     (uint)!bVar13 * auVar96._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar91._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar96._0_4_)))),auVar106);
          auVar213 = ZEXT3264(auVar119);
          auVar117 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar234._12_4_ |
                                                   (uint)!bVar18 * auVar99._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar234._8_4_ |
                                                            (uint)!bVar16 * auVar99._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar234._4_4_ |
                                                                     (uint)!bVar14 * auVar99._4_4_,
                                                                     (uint)(bVar71 & 1) *
                                                                     (int)auVar234._0_4_ |
                                                                     (uint)!(bool)(bVar71 & 1) *
                                                                     auVar99._0_4_)))),auVar135);
          auVar116 = vsubps_avx(auVar114,auVar136);
          auVar215 = ZEXT3264(auVar116);
          auVar104 = vsubps_avx(auVar106,auVar137);
          auVar105 = vsubps_avx(auVar135,auVar138);
          auVar55._4_4_ = auVar117._4_4_ * fVar147;
          auVar55._0_4_ = auVar117._0_4_ * fVar145;
          auVar55._8_4_ = auVar117._8_4_ * fVar150;
          auVar55._12_4_ = auVar117._12_4_ * fVar151;
          auVar55._16_4_ = auVar117._16_4_ * 0.0;
          auVar55._20_4_ = auVar117._20_4_ * 0.0;
          auVar55._24_4_ = auVar117._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar55,auVar135,auVar115);
          auVar189._0_4_ = fVar146 * auVar115._0_4_;
          auVar189._4_4_ = fVar149 * auVar115._4_4_;
          auVar189._8_4_ = fVar148 * auVar115._8_4_;
          auVar189._12_4_ = fVar152 * auVar115._12_4_;
          auVar189._16_4_ = auVar115._16_4_ * 0.0;
          auVar189._20_4_ = auVar115._20_4_ * 0.0;
          auVar189._24_4_ = auVar115._24_4_ * 0.0;
          auVar189._28_4_ = 0;
          auVar99 = vfmsub231ps_fma(auVar189,auVar114,auVar119);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar111,ZEXT1632(auVar96));
          auVar200._0_4_ = auVar119._0_4_ * auVar135._0_4_;
          auVar200._4_4_ = auVar119._4_4_ * auVar135._4_4_;
          auVar200._8_4_ = auVar119._8_4_ * auVar135._8_4_;
          auVar200._12_4_ = auVar119._12_4_ * auVar135._12_4_;
          auVar200._16_4_ = auVar119._16_4_ * fVar174;
          auVar200._20_4_ = auVar119._20_4_ * fVar219;
          auVar200._24_4_ = auVar119._24_4_ * fVar220;
          auVar200._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar200,auVar106,auVar117);
          auVar109 = vfmadd231ps_avx512vl(auVar118,auVar111,ZEXT1632(auVar96));
          auVar118 = vmulps_avx512vl(auVar105,auVar136);
          auVar118 = vfmsub231ps_avx512vl(auVar118,auVar116,auVar138);
          auVar56._4_4_ = auVar104._4_4_ * auVar138._4_4_;
          auVar56._0_4_ = auVar104._0_4_ * auVar138._0_4_;
          auVar56._8_4_ = auVar104._8_4_ * auVar138._8_4_;
          auVar56._12_4_ = auVar104._12_4_ * auVar138._12_4_;
          auVar56._16_4_ = auVar104._16_4_ * fVar144;
          auVar56._20_4_ = auVar104._20_4_ * fVar83;
          auVar56._24_4_ = auVar104._24_4_ * fVar82;
          auVar56._28_4_ = iVar2;
          auVar96 = vfmsub231ps_fma(auVar56,auVar137,auVar105);
          auVar201._0_4_ = auVar137._0_4_ * auVar116._0_4_;
          auVar201._4_4_ = auVar137._4_4_ * auVar116._4_4_;
          auVar201._8_4_ = auVar137._8_4_ * auVar116._8_4_;
          auVar201._12_4_ = auVar137._12_4_ * auVar116._12_4_;
          auVar201._16_4_ = fVar182 * auVar116._16_4_;
          auVar201._20_4_ = fVar173 * auVar116._20_4_;
          auVar201._24_4_ = fVar221 * auVar116._24_4_;
          auVar201._28_4_ = 0;
          auVar99 = vfmsub231ps_fma(auVar201,auVar104,auVar136);
          auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar111,auVar118);
          auVar110 = vfmadd231ps_avx512vl(auVar118,auVar111,ZEXT1632(auVar96));
          auVar204 = ZEXT3264(auVar110);
          auVar118 = vmaxps_avx(auVar109,auVar110);
          uVar166 = vcmpps_avx512vl(auVar118,auVar111,2);
          bVar79 = bVar79 & (byte)uVar166;
          if (bVar79 != 0) {
            auVar57._4_4_ = auVar105._4_4_ * auVar119._4_4_;
            auVar57._0_4_ = auVar105._0_4_ * auVar119._0_4_;
            auVar57._8_4_ = auVar105._8_4_ * auVar119._8_4_;
            auVar57._12_4_ = auVar105._12_4_ * auVar119._12_4_;
            auVar57._16_4_ = auVar105._16_4_ * auVar119._16_4_;
            auVar57._20_4_ = auVar105._20_4_ * auVar119._20_4_;
            auVar57._24_4_ = auVar105._24_4_ * auVar119._24_4_;
            auVar57._28_4_ = auVar118._28_4_;
            auVar21 = vfmsub231ps_fma(auVar57,auVar104,auVar117);
            auVar58._4_4_ = auVar117._4_4_ * auVar116._4_4_;
            auVar58._0_4_ = auVar117._0_4_ * auVar116._0_4_;
            auVar58._8_4_ = auVar117._8_4_ * auVar116._8_4_;
            auVar58._12_4_ = auVar117._12_4_ * auVar116._12_4_;
            auVar58._16_4_ = auVar117._16_4_ * auVar116._16_4_;
            auVar58._20_4_ = auVar117._20_4_ * auVar116._20_4_;
            auVar58._24_4_ = auVar117._24_4_ * auVar116._24_4_;
            auVar58._28_4_ = auVar117._28_4_;
            auVar98 = vfmsub231ps_fma(auVar58,auVar115,auVar105);
            auVar59._4_4_ = auVar104._4_4_ * auVar115._4_4_;
            auVar59._0_4_ = auVar104._0_4_ * auVar115._0_4_;
            auVar59._8_4_ = auVar104._8_4_ * auVar115._8_4_;
            auVar59._12_4_ = auVar104._12_4_ * auVar115._12_4_;
            auVar59._16_4_ = auVar104._16_4_ * auVar115._16_4_;
            auVar59._20_4_ = auVar104._20_4_ * auVar115._20_4_;
            auVar59._24_4_ = auVar104._24_4_ * auVar115._24_4_;
            auVar59._28_4_ = auVar104._28_4_;
            auVar92 = vfmsub231ps_fma(auVar59,auVar116,auVar119);
            auVar96 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar98),ZEXT1632(auVar92));
            auVar99 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar21),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar118 = vrcp14ps_avx512vl(ZEXT1632(auVar99));
            auVar215 = ZEXT3264(auVar118);
            auVar33._8_4_ = 0x3f800000;
            auVar33._0_8_ = 0x3f8000003f800000;
            auVar33._12_4_ = 0x3f800000;
            auVar33._16_4_ = 0x3f800000;
            auVar33._20_4_ = 0x3f800000;
            auVar33._24_4_ = 0x3f800000;
            auVar33._28_4_ = 0x3f800000;
            auVar119 = vfnmadd213ps_avx512vl(auVar118,ZEXT1632(auVar99),auVar33);
            auVar96 = vfmadd132ps_fma(auVar119,auVar118,auVar118);
            auVar213 = ZEXT1664(auVar96);
            auVar60._4_4_ = auVar92._4_4_ * auVar135._4_4_;
            auVar60._0_4_ = auVar92._0_4_ * auVar135._0_4_;
            auVar60._8_4_ = auVar92._8_4_ * auVar135._8_4_;
            auVar60._12_4_ = auVar92._12_4_ * auVar135._12_4_;
            auVar60._16_4_ = fVar174 * 0.0;
            auVar60._20_4_ = fVar219 * 0.0;
            auVar60._24_4_ = fVar220 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar98 = vfmadd231ps_fma(auVar60,auVar106,ZEXT1632(auVar98));
            auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar114,ZEXT1632(auVar21));
            fVar174 = auVar96._0_4_;
            fVar219 = auVar96._4_4_;
            fVar220 = auVar96._8_4_;
            fVar221 = auVar96._12_4_;
            local_400 = ZEXT1632(CONCAT412(auVar98._12_4_ * fVar221,
                                           CONCAT48(auVar98._8_4_ * fVar220,
                                                    CONCAT44(auVar98._4_4_ * fVar219,
                                                             auVar98._0_4_ * fVar174))));
            auVar218 = ZEXT3264(local_400);
            auVar70._4_4_ = uStack_55c;
            auVar70._0_4_ = local_560;
            auVar70._8_4_ = uStack_558;
            auVar70._12_4_ = uStack_554;
            auVar70._16_4_ = uStack_550;
            auVar70._20_4_ = uStack_54c;
            auVar70._24_4_ = uStack_548;
            auVar70._28_4_ = uStack_544;
            uVar166 = vcmpps_avx512vl(local_400,auVar70,0xd);
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar34._4_4_ = uVar165;
            auVar34._0_4_ = uVar165;
            auVar34._8_4_ = uVar165;
            auVar34._12_4_ = uVar165;
            auVar34._16_4_ = uVar165;
            auVar34._20_4_ = uVar165;
            auVar34._24_4_ = uVar165;
            auVar34._28_4_ = uVar165;
            uVar23 = vcmpps_avx512vl(local_400,auVar34,2);
            bVar79 = (byte)uVar166 & (byte)uVar23 & bVar79;
            if (bVar79 != 0) {
              uVar81 = vcmpps_avx512vl(ZEXT1632(auVar99),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar81 = bVar79 & uVar81;
              if ((char)uVar81 != '\0') {
                fVar173 = auVar109._0_4_ * fVar174;
                fVar182 = auVar109._4_4_ * fVar219;
                auVar61._4_4_ = fVar182;
                auVar61._0_4_ = fVar173;
                fVar82 = auVar109._8_4_ * fVar220;
                auVar61._8_4_ = fVar82;
                fVar83 = auVar109._12_4_ * fVar221;
                auVar61._12_4_ = fVar83;
                fVar144 = auVar109._16_4_ * 0.0;
                auVar61._16_4_ = fVar144;
                fVar145 = auVar109._20_4_ * 0.0;
                auVar61._20_4_ = fVar145;
                fVar146 = auVar109._24_4_ * 0.0;
                auVar61._24_4_ = fVar146;
                auVar61._28_4_ = auVar109._28_4_;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar118 = vsubps_avx(auVar181,auVar61);
                local_440._0_4_ =
                     (float)((uint)(bVar71 & 1) * (int)fVar173 |
                            (uint)!(bool)(bVar71 & 1) * auVar118._0_4_);
                bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                local_440._4_4_ =
                     (float)((uint)bVar13 * (int)fVar182 | (uint)!bVar13 * auVar118._4_4_);
                bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                local_440._8_4_ =
                     (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar118._8_4_);
                bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                local_440._12_4_ =
                     (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar118._12_4_);
                bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
                local_440._16_4_ =
                     (float)((uint)bVar13 * (int)fVar144 | (uint)!bVar13 * auVar118._16_4_);
                bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
                local_440._20_4_ =
                     (float)((uint)bVar13 * (int)fVar145 | (uint)!bVar13 * auVar118._20_4_);
                bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
                local_440._24_4_ =
                     (float)((uint)bVar13 * (int)fVar146 | (uint)!bVar13 * auVar118._24_4_);
                bVar13 = SUB81(uVar72 >> 7,0);
                local_440._28_4_ =
                     (float)((uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar118._28_4_);
                auVar118 = vsubps_avx(auVar108,auVar107);
                auVar96 = vfmadd213ps_fma(auVar118,local_440,auVar107);
                uVar165 = *(undefined4 *)((long)local_608->ray_space + k * 4 + -0x20);
                auVar35._4_4_ = uVar165;
                auVar35._0_4_ = uVar165;
                auVar35._8_4_ = uVar165;
                auVar35._12_4_ = uVar165;
                auVar35._16_4_ = uVar165;
                auVar35._20_4_ = uVar165;
                auVar35._24_4_ = uVar165;
                auVar35._28_4_ = uVar165;
                auVar118 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar96._12_4_ + auVar96._12_4_,
                                                              CONCAT48(auVar96._8_4_ + auVar96._8_4_
                                                                       ,CONCAT44(auVar96._4_4_ +
                                                                                 auVar96._4_4_,
                                                                                 auVar96._0_4_ +
                                                                                 auVar96._0_4_)))),
                                           auVar35);
                uVar22 = vcmpps_avx512vl(local_400,auVar118,6);
                uVar81 = uVar81 & uVar22;
                uVar80 = (uint)uVar81;
                bVar79 = (byte)uVar81;
                if (bVar79 != 0) {
                  auVar172._0_4_ = auVar110._0_4_ * fVar174;
                  auVar172._4_4_ = auVar110._4_4_ * fVar219;
                  auVar172._8_4_ = auVar110._8_4_ * fVar220;
                  auVar172._12_4_ = auVar110._12_4_ * fVar221;
                  auVar172._16_4_ = auVar110._16_4_ * 0.0;
                  auVar172._20_4_ = auVar110._20_4_ * 0.0;
                  auVar172._24_4_ = auVar110._24_4_ * 0.0;
                  auVar172._28_4_ = 0;
                  auVar190._8_4_ = 0x3f800000;
                  auVar190._0_8_ = 0x3f8000003f800000;
                  auVar190._12_4_ = 0x3f800000;
                  auVar190._16_4_ = 0x3f800000;
                  auVar190._20_4_ = 0x3f800000;
                  auVar190._24_4_ = 0x3f800000;
                  auVar190._28_4_ = 0x3f800000;
                  auVar118 = vsubps_avx(auVar190,auVar172);
                  auVar140._0_4_ =
                       (uint)(bVar71 & 1) * (int)auVar172._0_4_ |
                       (uint)!(bool)(bVar71 & 1) * auVar118._0_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 1) & 1);
                  auVar140._4_4_ =
                       (uint)bVar13 * (int)auVar172._4_4_ | (uint)!bVar13 * auVar118._4_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 2) & 1);
                  auVar140._8_4_ =
                       (uint)bVar13 * (int)auVar172._8_4_ | (uint)!bVar13 * auVar118._8_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 3) & 1);
                  auVar140._12_4_ =
                       (uint)bVar13 * (int)auVar172._12_4_ | (uint)!bVar13 * auVar118._12_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 4) & 1);
                  auVar140._16_4_ =
                       (uint)bVar13 * (int)auVar172._16_4_ | (uint)!bVar13 * auVar118._16_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
                  auVar140._20_4_ =
                       (uint)bVar13 * (int)auVar172._20_4_ | (uint)!bVar13 * auVar118._20_4_;
                  bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
                  auVar140._24_4_ =
                       (uint)bVar13 * (int)auVar172._24_4_ | (uint)!bVar13 * auVar118._24_4_;
                  auVar140._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar118._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_420 = vfmsub132ps_avx512vl(auVar140,auVar190,auVar36);
                  local_3e0 = (undefined4)lVar75;
                  local_3d0 = local_670;
                  uStack_3c8 = uStack_668;
                  local_3c0 = local_680;
                  uStack_3b8 = uStack_678;
                  local_3b0 = local_690;
                  uStack_3a8 = uStack_688;
                  local_3a0 = local_6a0;
                  uStack_398 = uStack_698;
                  pGVar77 = (context->scene->geometries).items[uVar7].ptr;
                  if ((pGVar77->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    auVar96 = vcvtsi2ss_avx512f(auVar103,local_3e0);
                    fVar174 = auVar96._0_4_;
                    local_380[0] = (fVar174 + local_440._0_4_ + 0.0) * local_100;
                    local_380[1] = (fVar174 + local_440._4_4_ + 1.0) * fStack_fc;
                    local_380[2] = (fVar174 + local_440._8_4_ + 2.0) * fStack_f8;
                    local_380[3] = (fVar174 + local_440._12_4_ + 3.0) * fStack_f4;
                    fStack_370 = (fVar174 + local_440._16_4_ + 4.0) * fStack_f0;
                    fStack_36c = (fVar174 + local_440._20_4_ + 5.0) * fStack_ec;
                    fStack_368 = (fVar174 + local_440._24_4_ + 6.0) * fStack_e8;
                    fStack_364 = fVar174 + local_440._28_4_ + 7.0;
                    local_360 = local_420;
                    local_340 = local_400;
                    auVar160._8_4_ = 0x7f800000;
                    auVar160._0_8_ = 0x7f8000007f800000;
                    auVar160._12_4_ = 0x7f800000;
                    auVar160._16_4_ = 0x7f800000;
                    auVar160._20_4_ = 0x7f800000;
                    auVar160._24_4_ = 0x7f800000;
                    auVar160._28_4_ = 0x7f800000;
                    auVar118 = vblendmps_avx512vl(auVar160,local_400);
                    auVar141._0_4_ =
                         (uint)(bVar79 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                    auVar141._4_4_ = (uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
                    auVar141._8_4_ = (uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
                    auVar141._12_4_ = (uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
                    auVar141._16_4_ = (uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
                    auVar141._20_4_ = (uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
                    auVar141._24_4_ = (uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar81 >> 7,0);
                    auVar141._28_4_ = (uint)bVar13 * auVar118._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar118 = vshufps_avx(auVar141,auVar141,0xb1);
                    auVar118 = vminps_avx(auVar141,auVar118);
                    auVar119 = vshufpd_avx(auVar118,auVar118,5);
                    auVar118 = vminps_avx(auVar118,auVar119);
                    auVar119 = vpermpd_avx2(auVar118,0x4e);
                    auVar118 = vminps_avx(auVar118,auVar119);
                    uVar166 = vcmpps_avx512vl(auVar141,auVar118,0);
                    if ((bVar79 & (byte)uVar166) != 0) {
                      uVar80 = (uint)(bVar79 & (byte)uVar166);
                    }
                    uVar73 = 0;
                    for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar72 = (ulong)uVar73;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_630 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                      local_618 = pGVar77;
                      local_5d8 = uVar74;
                      local_5c0 = local_400;
                      local_3dc = iVar8;
                      do {
                        fVar174 = local_380[uVar72];
                        auVar170._4_4_ = fVar174;
                        auVar170._0_4_ = fVar174;
                        auVar170._8_4_ = fVar174;
                        auVar170._12_4_ = fVar174;
                        local_1c0._16_4_ = fVar174;
                        local_1c0._0_16_ = auVar170;
                        local_1c0._20_4_ = fVar174;
                        local_1c0._24_4_ = fVar174;
                        local_1c0._28_4_ = fVar174;
                        local_1a0 = *(undefined4 *)(local_360 + uVar72 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_340 + uVar72 * 4);
                        local_660.context = context->user;
                        fVar219 = 1.0 - fVar174;
                        auVar28._8_4_ = 0x80000000;
                        auVar28._0_8_ = 0x8000000080000000;
                        auVar28._12_4_ = 0x80000000;
                        auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar219),auVar28);
                        auVar96 = ZEXT416((uint)(fVar174 * fVar219 * 4.0));
                        auVar99 = vfnmsub213ss_fma(auVar170,auVar170,auVar96);
                        auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),
                                                  auVar96);
                        auVar215 = ZEXT464(0x3f000000);
                        fVar219 = fVar219 * auVar98._0_4_ * 0.5;
                        fVar220 = auVar99._0_4_ * 0.5;
                        fVar221 = auVar96._0_4_ * 0.5;
                        fVar174 = fVar174 * fVar174 * 0.5;
                        auVar207._0_4_ = fVar174 * fVar20;
                        auVar207._4_4_ = fVar174 * fVar62;
                        auVar207._8_4_ = fVar174 * fVar63;
                        auVar207._12_4_ = fVar174 * fVar64;
                        auVar153._4_4_ = fVar221;
                        auVar153._0_4_ = fVar221;
                        auVar153._8_4_ = fVar221;
                        auVar153._12_4_ = fVar221;
                        auVar96 = vfmadd132ps_fma(auVar153,auVar207,auVar93);
                        auVar196._4_4_ = fVar220;
                        auVar196._0_4_ = fVar220;
                        auVar196._8_4_ = fVar220;
                        auVar196._12_4_ = fVar220;
                        auVar96 = vfmadd132ps_fma(auVar196,auVar96,auVar6);
                        auVar154._4_4_ = fVar219;
                        auVar154._0_4_ = fVar219;
                        auVar154._8_4_ = fVar219;
                        auVar154._12_4_ = fVar219;
                        auVar96 = vfmadd132ps_fma(auVar154,auVar96,auVar97);
                        local_220 = auVar96._0_4_;
                        auVar202._8_4_ = 1;
                        auVar202._0_8_ = 0x100000001;
                        auVar202._12_4_ = 1;
                        auVar202._16_4_ = 1;
                        auVar202._20_4_ = 1;
                        auVar202._24_4_ = 1;
                        auVar202._28_4_ = 1;
                        local_200 = vpermps_avx2(auVar202,ZEXT1632(auVar96));
                        auVar204 = ZEXT3264(local_200);
                        auVar208._8_4_ = 2;
                        auVar208._0_8_ = 0x200000002;
                        auVar208._12_4_ = 2;
                        auVar211._16_4_ = 2;
                        auVar211._0_16_ = auVar208;
                        auVar211._20_4_ = 2;
                        auVar211._24_4_ = 2;
                        auVar211._28_4_ = 2;
                        auVar213 = ZEXT3264(auVar211);
                        local_1e0 = vpermps_avx2(auVar211,ZEXT1632(auVar96));
                        iStack_21c = local_220;
                        iStack_218 = local_220;
                        iStack_214 = local_220;
                        iStack_210 = local_220;
                        iStack_20c = local_220;
                        iStack_208 = local_220;
                        iStack_204 = local_220;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_2e0._0_8_;
                        uStack_178 = local_2e0._8_8_;
                        uStack_170 = local_2e0._16_8_;
                        uStack_168 = local_2e0._24_8_;
                        local_160 = local_2c0;
                        auVar118 = vpcmpeqd_avx2(local_2c0,local_2c0);
                        local_610[1] = auVar118;
                        *local_610 = auVar118;
                        local_140 = (local_660.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_660.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_600 = local_300;
                        local_660.valid = (int *)local_600;
                        local_660.geometryUserPtr = pGVar77->userPtr;
                        local_660.hit = (RTCHitN *)&local_220;
                        local_660.N = 8;
                        local_660.ray = (RTCRayN *)ray;
                        if (pGVar77->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar204 = ZEXT1664(local_200._0_16_);
                          auVar213 = ZEXT1664(auVar208);
                          auVar215 = ZEXT1664(auVar215._0_16_);
                          (*pGVar77->intersectionFilterN)(&local_660);
                          auVar218 = ZEXT3264(local_5c0);
                          pGVar77 = local_618;
                        }
                        if (local_600 == (undefined1  [32])0x0) {
LAB_018ea028:
                          *(undefined4 *)(ray + k * 4 + 0x100) = local_630._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar77->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar204 = ZEXT1664(auVar204._0_16_);
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            auVar215 = ZEXT1664(auVar215._0_16_);
                            (*p_Var12)(&local_660);
                            auVar218 = ZEXT3264(local_5c0);
                            pGVar77 = local_618;
                          }
                          if (local_600 == (undefined1  [32])0x0) goto LAB_018ea028;
                          uVar74 = vptestmd_avx512vl(local_600,local_600);
                          iVar1 = *(int *)(local_660.hit + 4);
                          iVar2 = *(int *)(local_660.hit + 8);
                          iVar65 = *(int *)(local_660.hit + 0xc);
                          iVar66 = *(int *)(local_660.hit + 0x10);
                          iVar67 = *(int *)(local_660.hit + 0x14);
                          iVar68 = *(int *)(local_660.hit + 0x18);
                          iVar69 = *(int *)(local_660.hit + 0x1c);
                          bVar79 = (byte)uVar74;
                          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar19 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_660.ray + 0x180) =
                               (uint)(bVar79 & 1) * *(int *)local_660.hit |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x180);
                          *(uint *)(local_660.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x184);
                          *(uint *)(local_660.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x188);
                          *(uint *)(local_660.ray + 0x18c) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x18c);
                          *(uint *)(local_660.ray + 400) =
                               (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_660.ray + 400)
                          ;
                          *(uint *)(local_660.ray + 0x194) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x194);
                          *(uint *)(local_660.ray + 0x198) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x198);
                          *(uint *)(local_660.ray + 0x19c) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x19c);
                          iVar1 = *(int *)(local_660.hit + 0x24);
                          iVar2 = *(int *)(local_660.hit + 0x28);
                          iVar65 = *(int *)(local_660.hit + 0x2c);
                          iVar66 = *(int *)(local_660.hit + 0x30);
                          iVar67 = *(int *)(local_660.hit + 0x34);
                          iVar68 = *(int *)(local_660.hit + 0x38);
                          iVar69 = *(int *)(local_660.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar19 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_660.ray + 0x1a0) =
                               (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x20) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1a0);
                          *(uint *)(local_660.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1a4);
                          *(uint *)(local_660.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1a8);
                          *(uint *)(local_660.ray + 0x1ac) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ac);
                          *(uint *)(local_660.ray + 0x1b0) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1b0);
                          *(uint *)(local_660.ray + 0x1b4) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1b4);
                          *(uint *)(local_660.ray + 0x1b8) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1b8);
                          *(uint *)(local_660.ray + 0x1bc) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1bc);
                          iVar1 = *(int *)(local_660.hit + 0x44);
                          iVar2 = *(int *)(local_660.hit + 0x48);
                          iVar65 = *(int *)(local_660.hit + 0x4c);
                          iVar66 = *(int *)(local_660.hit + 0x50);
                          iVar67 = *(int *)(local_660.hit + 0x54);
                          iVar68 = *(int *)(local_660.hit + 0x58);
                          iVar69 = *(int *)(local_660.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar19 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_660.ray + 0x1c0) =
                               (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x40) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1c0);
                          *(uint *)(local_660.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1c4);
                          *(uint *)(local_660.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1c8);
                          *(uint *)(local_660.ray + 0x1cc) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1cc);
                          *(uint *)(local_660.ray + 0x1d0) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1d0);
                          *(uint *)(local_660.ray + 0x1d4) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x1d4);
                          *(uint *)(local_660.ray + 0x1d8) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1d8);
                          *(uint *)(local_660.ray + 0x1dc) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1dc);
                          iVar1 = *(int *)(local_660.hit + 100);
                          iVar2 = *(int *)(local_660.hit + 0x68);
                          iVar65 = *(int *)(local_660.hit + 0x6c);
                          iVar66 = *(int *)(local_660.hit + 0x70);
                          iVar67 = *(int *)(local_660.hit + 0x74);
                          iVar68 = *(int *)(local_660.hit + 0x78);
                          iVar69 = *(int *)(local_660.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar19 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_660.ray + 0x1e0) =
                               (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x60) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x1e0);
                          *(uint *)(local_660.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x1e4);
                          *(uint *)(local_660.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x1e8);
                          *(uint *)(local_660.ray + 0x1ec) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x1ec);
                          *(uint *)(local_660.ray + 0x1f0) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x1f0);
                          *(uint *)(local_660.ray + 500) =
                               (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_660.ray + 500)
                          ;
                          *(uint *)(local_660.ray + 0x1f8) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x1f8);
                          *(uint *)(local_660.ray + 0x1fc) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x1fc);
                          iVar1 = *(int *)(local_660.hit + 0x84);
                          iVar2 = *(int *)(local_660.hit + 0x88);
                          iVar65 = *(int *)(local_660.hit + 0x8c);
                          iVar66 = *(int *)(local_660.hit + 0x90);
                          iVar67 = *(int *)(local_660.hit + 0x94);
                          iVar68 = *(int *)(local_660.hit + 0x98);
                          iVar69 = *(int *)(local_660.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar74 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar74 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar74 >> 6) & 1);
                          bVar19 = SUB81(uVar74 >> 7,0);
                          *(uint *)(local_660.ray + 0x200) =
                               (uint)(bVar79 & 1) * *(int *)(local_660.hit + 0x80) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_660.ray + 0x200);
                          *(uint *)(local_660.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_660.ray + 0x204);
                          *(uint *)(local_660.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_660.ray + 0x208);
                          *(uint *)(local_660.ray + 0x20c) =
                               (uint)bVar15 * iVar65 |
                               (uint)!bVar15 * *(int *)(local_660.ray + 0x20c);
                          *(uint *)(local_660.ray + 0x210) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_660.ray + 0x210);
                          *(uint *)(local_660.ray + 0x214) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_660.ray + 0x214);
                          *(uint *)(local_660.ray + 0x218) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_660.ray + 0x218);
                          *(uint *)(local_660.ray + 0x21c) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_660.ray + 0x21c);
                          auVar118 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x220) = auVar118;
                          auVar118 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x240) = auVar118;
                          auVar118 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_660.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_660.ray + 0x260) = auVar118;
                          auVar118 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_660.hit + 0x100));
                          *(undefined1 (*) [32])(local_660.ray + 0x280) = auVar118;
                          local_630._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                          local_630._4_4_ = 0;
                          local_630._8_4_ = 0;
                          local_630._12_4_ = 0;
                        }
                        bVar79 = ~(byte)(1 << ((uint)uVar72 & 0x1f)) & (byte)uVar81;
                        auVar161._4_4_ = local_630._0_4_;
                        auVar161._0_4_ = local_630._0_4_;
                        auVar161._8_4_ = local_630._0_4_;
                        auVar161._12_4_ = local_630._0_4_;
                        auVar161._16_4_ = local_630._0_4_;
                        auVar161._20_4_ = local_630._0_4_;
                        auVar161._24_4_ = local_630._0_4_;
                        auVar161._28_4_ = local_630._0_4_;
                        uVar166 = vcmpps_avx512vl(auVar218._0_32_,auVar161,2);
                        if ((bVar79 & (byte)uVar166) == 0) goto LAB_018ea0c8;
                        bVar79 = bVar79 & (byte)uVar166;
                        uVar81 = (ulong)bVar79;
                        auVar162._8_4_ = 0x7f800000;
                        auVar162._0_8_ = 0x7f8000007f800000;
                        auVar162._12_4_ = 0x7f800000;
                        auVar162._16_4_ = 0x7f800000;
                        auVar162._20_4_ = 0x7f800000;
                        auVar162._24_4_ = 0x7f800000;
                        auVar162._28_4_ = 0x7f800000;
                        auVar118 = vblendmps_avx512vl(auVar162,auVar218._0_32_);
                        auVar142._0_4_ =
                             (uint)(bVar79 & 1) * auVar118._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 1 & 1);
                        auVar142._4_4_ = (uint)bVar13 * auVar118._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 2 & 1);
                        auVar142._8_4_ = (uint)bVar13 * auVar118._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 3 & 1);
                        auVar142._12_4_ =
                             (uint)bVar13 * auVar118._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 4 & 1);
                        auVar142._16_4_ =
                             (uint)bVar13 * auVar118._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 5 & 1);
                        auVar142._20_4_ =
                             (uint)bVar13 * auVar118._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar79 >> 6 & 1);
                        auVar142._24_4_ =
                             (uint)bVar13 * auVar118._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar142._28_4_ =
                             (uint)(bVar79 >> 7) * auVar118._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar118 = vshufps_avx(auVar142,auVar142,0xb1);
                        auVar118 = vminps_avx(auVar142,auVar118);
                        auVar119 = vshufpd_avx(auVar118,auVar118,5);
                        auVar118 = vminps_avx(auVar118,auVar119);
                        auVar119 = vpermpd_avx2(auVar118,0x4e);
                        auVar118 = vminps_avx(auVar118,auVar119);
                        uVar166 = vcmpps_avx512vl(auVar142,auVar118,0);
                        bVar71 = (byte)uVar166 & bVar79;
                        if (bVar71 != 0) {
                          bVar79 = bVar71;
                        }
                        uVar80 = 0;
                        for (uVar73 = (uint)bVar79; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar80 = uVar80 + 1;
                        }
                        uVar72 = (ulong)uVar80;
                      } while( true );
                    }
                    fVar174 = local_380[uVar72];
                    uVar165 = *(undefined4 *)(local_360 + uVar72 * 4);
                    fVar219 = 1.0 - fVar174;
                    auVar27._8_4_ = 0x80000000;
                    auVar27._0_8_ = 0x8000000080000000;
                    auVar27._12_4_ = 0x80000000;
                    auVar98 = vxorps_avx512vl(ZEXT416((uint)fVar219),auVar27);
                    auVar96 = ZEXT416((uint)(fVar174 * fVar219 * 4.0));
                    auVar99 = vfnmsub213ss_fma(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),auVar96
                                              );
                    auVar96 = vfmadd213ss_fma(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),auVar96)
                    ;
                    fVar219 = fVar219 * auVar98._0_4_ * 0.5;
                    fVar220 = auVar99._0_4_ * 0.5;
                    auVar213 = ZEXT464((uint)fVar220);
                    fVar221 = auVar96._0_4_ * 0.5;
                    fVar173 = fVar174 * fVar174 * 0.5;
                    auVar194._0_4_ = fVar173 * fVar20;
                    auVar194._4_4_ = fVar173 * fVar62;
                    auVar194._8_4_ = fVar173 * fVar63;
                    auVar194._12_4_ = fVar173 * fVar64;
                    auVar178._4_4_ = fVar221;
                    auVar178._0_4_ = fVar221;
                    auVar178._8_4_ = fVar221;
                    auVar178._12_4_ = fVar221;
                    auVar96 = vfmadd132ps_fma(auVar178,auVar194,auVar93);
                    auVar195._4_4_ = fVar220;
                    auVar195._0_4_ = fVar220;
                    auVar195._8_4_ = fVar220;
                    auVar195._12_4_ = fVar220;
                    auVar96 = vfmadd132ps_fma(auVar195,auVar96,auVar6);
                    auVar204 = ZEXT1664(auVar96);
                    auVar179._4_4_ = fVar219;
                    auVar179._0_4_ = fVar219;
                    auVar179._8_4_ = fVar219;
                    auVar179._12_4_ = fVar219;
                    auVar96 = vfmadd132ps_fma(auVar179,auVar96,auVar97);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_340 + uVar72 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar96._0_4_;
                    uVar9 = vextractps_avx(auVar96,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                    uVar9 = vextractps_avx(auVar96,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar9;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar165;
                    *(int *)(ray + k * 4 + 0x220) = (int)uVar74;
                    *(uint *)(ray + k * 4 + 0x240) = uVar7;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_018e9d09;
      }
    }
    uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar26._4_4_ = uVar165;
    auVar26._0_4_ = uVar165;
    auVar26._8_4_ = uVar165;
    auVar26._12_4_ = uVar165;
    uVar166 = vcmpps_avx512vl(local_310,auVar26,2);
    local_5c8 = (ulong)((uint)local_5c8 & (uint)local_5c8 + 0xf & (uint)uVar166);
  } while( true );
LAB_018ea0c8:
  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar96);
  auVar236 = ZEXT464(0xbf800000);
  uVar74 = local_5d8;
LAB_018e9d09:
  lVar75 = lVar75 + 8;
  goto LAB_018e942c;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }